

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  ImWchar IVar6;
  undefined2 uVar7;
  ImFont *pIVar8;
  stbtt_fontinfo *info;
  undefined8 *puVar9;
  ImFontConfig *pIVar10;
  char cVar11;
  char cVar16;
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [14];
  undefined1 auVar30 [16];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  stbtt__buf fontdict;
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [13];
  undefined1 auVar39 [14];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  unkbyte10 Var44;
  uint6 uVar45;
  undefined1 auVar46 [14];
  undefined1 auVar47 [16];
  stbtt__active_edge **ppsVar48;
  ushort uVar49;
  ushort uVar50;
  short sVar51;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar57;
  uint uVar58;
  int iVar59;
  int iVar60;
  stbtt__active_edge *z_1;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  void *pvVar61;
  int extraout_var;
  int *piVar62;
  long lVar63;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  uchar *puVar64;
  void *pvVar65;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar66;
  stbtt__buf *psVar67;
  undefined8 *puVar68;
  stbtt__active_edge *psVar69;
  bool bVar70;
  short sVar71;
  uint uVar72;
  uint uVar73;
  ImWchar *pIVar74;
  ushort *puVar75;
  long lVar76;
  int x;
  uint uVar77;
  long lVar78;
  bool bVar79;
  int iVar80;
  stbtt__active_edge *z;
  ulong uVar81;
  ImU32 bit_n;
  long lVar82;
  ImFontAtlas *atlas_00;
  uchar uVar83;
  void *pvVar84;
  stbtt__edge *psVar85;
  ulong uVar86;
  ulong uVar87;
  uint *puVar88;
  stbrp_node **ppsVar89;
  byte *pbVar90;
  void *pvVar91;
  stbtt__edge *psVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  ulong uVar96;
  ImU32 mask;
  uint uVar97;
  float fVar98;
  stbtt_fontinfo *psVar99;
  byte *pbVar100;
  bool bVar101;
  byte bVar102;
  char cVar110;
  char cVar111;
  char cVar113;
  ushort uVar112;
  short sVar114;
  short sVar115;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar138;
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar140;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar146;
  float fVar147;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  uint uVar148;
  float fVar149;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  undefined4 uVar151;
  uint uVar158;
  float fVar159;
  uint uVar160;
  float fVar161;
  uint uVar162;
  float fVar163;
  undefined1 auVar156 [16];
  float fVar164;
  uint uVar169;
  uint uVar171;
  undefined1 auVar165 [16];
  float fVar170;
  float fVar172;
  uint uVar173;
  float fVar174;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined4 uVar175;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  stbtt__buf sVar190;
  ImU32 *it_end;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  ImFontConfig *pIVar191;
  undefined1 local_4b8 [16];
  uint local_4a0;
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  ulong local_488;
  float local_47c;
  undefined1 local_478 [16];
  stbtt__edge *local_468;
  undefined8 local_460;
  int local_454;
  void *local_450;
  undefined1 local_448 [16];
  ulong local_438;
  undefined8 local_430;
  int local_424;
  int local_420;
  float local_41c;
  undefined1 local_418 [8];
  void *pvStack_410;
  long local_408;
  void *pvStack_400;
  ulong local_3f8;
  stbtt__active_edge *local_3f0;
  ulong local_3e8;
  float local_3dc;
  long local_3d8;
  void *pvStack_3d0;
  stbtt_fontinfo *local_3c0;
  undefined8 *local_3b8;
  long local_3b0;
  long local_3a8;
  void *pvStack_3a0;
  void *local_398;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  uchar *local_388;
  ulong local_380;
  ulong local_378;
  uchar *local_370;
  float *local_368;
  int local_35c;
  uint local_358;
  uint local_354;
  float local_350;
  int local_34c;
  int local_348;
  int local_344;
  stbrp_context *local_340;
  long local_338;
  float *local_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [16];
  stbrp_node *local_300;
  ImFontConfig *local_2f8;
  long local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  long local_2d8;
  short *local_2d0;
  long local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined6 uVar152;
  undefined8 uVar153;
  undefined1 auVar154 [12];
  undefined1 auVar155 [14];
  undefined1 auVar157 [16];
  undefined6 uVar176;
  undefined8 uVar177;
  undefined1 auVar178 [12];
  undefined1 auVar179 [14];
  undefined1 auVar183 [16];
  
  uVar153 = local_4b8._0_8_;
  local_478._8_8_ = local_478._0_8_;
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  local_408 = 0;
  pvStack_400 = (void *)0x0;
  local_3d8 = 0;
  pvStack_3d0 = (void *)0x0;
  uVar58 = (atlas->ConfigData).Size;
  if (0 < (long)(int)uVar58) {
    uVar81 = 8;
    if (8 < uVar58) {
      uVar81 = (ulong)uVar58;
    }
    pvStack_400 = ImGui::MemAlloc(uVar81 * 0x110);
    local_408 = uVar81 << 0x20;
  }
  pvVar65 = pvStack_400;
  local_478._0_8_ = (long)(int)uVar58;
  local_408 = CONCAT44(local_408._4_4_,uVar58);
  uVar58 = (atlas->Fonts).Size;
  if ((long)(int)uVar58 < 1) {
    pvVar61 = (void *)0x0;
  }
  else {
    uVar81 = 8;
    if (8 < uVar58) {
      uVar81 = (ulong)uVar58;
    }
    pvVar61 = ImGui::MemAlloc(uVar81 << 5);
    local_3d8 = uVar81 << 0x20;
    pvStack_3d0 = pvVar61;
  }
  local_3d8 = CONCAT44(local_3d8._4_4_,uVar58);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_4b8._0_8_;
  local_4b8 = auVar117 << 0x40;
  auVar117 = local_4b8;
  local_4b8._8_8_ = uVar153;
  memset(pvVar65,0,local_478._0_8_ * 0x110);
  memset(pvVar61,0,(long)(int)uVar58 << 5);
  local_498._8_8_ = atlas;
  if (0 < (atlas->ConfigData).Size) {
    pvVar91 = (void *)0x0;
    local_4b8 = auVar117;
    do {
      pIVar191 = ((ImVector<ImFontConfig> *)(local_498._8_8_ + 0x68))->Data + (long)pvVar91;
      lVar82 = (long)pvVar91 * 0x110;
      *(undefined4 *)((long)pvVar65 + lVar82 + 0xe0) = 0xffffffff;
      uVar81 = (ulong)((ImVector<ImFont_*> *)(local_498._8_8_ + 0x48))->Size;
      if ((long)uVar81 < 1) {
LAB_001335ef:
        bVar101 = false;
        goto LAB_001335bc;
      }
      uVar96 = 0;
      while (pIVar8 = ((ImVector<ImFont_*> *)(local_498._8_8_ + 0x48))->Data[uVar96],
            pIVar191->DstFont != pIVar8) {
        uVar96 = uVar96 + 1;
        bVar101 = false;
        if ((uVar81 <= uVar96) || (pIVar191->DstFont == pIVar8)) goto LAB_001335bc;
      }
      *(int *)((long)pvVar65 + lVar82 + 0xe0) = (int)uVar96;
      pbVar100 = (byte *)pIVar191->FontData;
      iVar80 = pIVar191->FontNo;
      bVar102 = *pbVar100;
      sVar57 = 0xffffffff;
      if (bVar102 < 0x4f) {
        if (bVar102 == 0) {
          if (pbVar100[1] == 1) goto LAB_0013039e;
        }
        else if ((bVar102 == 0x31) && (pbVar100[1] == 0)) {
LAB_0013039e:
          if ((pbVar100[2] == 0) && (pbVar100[3] == 0)) {
LAB_0013040a:
            sVar57 = -(uint)(iVar80 != 0);
          }
        }
      }
      else if (bVar102 == 0x4f) {
        if (((pbVar100[1] == 0x54) && (pbVar100[2] == 0x54)) && (pbVar100[3] == 0x4f))
        goto LAB_0013040a;
      }
      else if (bVar102 == 0x74) {
        bVar102 = pbVar100[1];
        if (bVar102 == 0x72) {
          if ((pbVar100[2] == 0x75) && (pbVar100[3] == 0x65)) goto LAB_0013040a;
        }
        else if (bVar102 == 0x74) {
          if ((pbVar100[2] == 99) && (pbVar100[3] == 0x66)) {
            uVar58 = *(uint *)(pbVar100 + 4);
            uVar58 = uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                     uVar58 << 0x18;
            if (((uVar58 == 0x20000) || (uVar58 == 0x10000)) &&
               (uVar58 = *(uint *)(pbVar100 + 8),
               iVar80 < (int)(uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                             uVar58 << 0x18))) {
              uVar58 = *(uint *)(pbVar100 + (long)iVar80 * 4 + 0xc);
              sVar57 = uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                       uVar58 << 0x18;
            }
          }
        }
        else if (((bVar102 == 0x79) && (pbVar100[2] == 0x70)) && (pbVar100[3] == 0x31))
        goto LAB_0013040a;
      }
      *(byte **)((long)pvVar65 + lVar82 + 8) = pbVar100;
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x10) = sVar57;
      *(undefined8 *)((long)pvVar65 + lVar82 + 0x40) = 0;
      *(undefined8 *)((long)pvVar65 + lVar82 + 0x48) = 0;
      local_398 = pvVar91;
      sVar52 = stbtt__find_table(pbVar100,sVar57,"cmap");
      iVar80 = extraout_var;
      local_47c = (float)stbtt__find_table(pbVar100,sVar57,"loca");
      *(float *)((long)pvVar65 + lVar82 + 0x18) = local_47c;
      sVar53 = stbtt__find_table(pbVar100,sVar57,"head");
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x1c) = sVar53;
      sVar54 = stbtt__find_table(pbVar100,sVar57,"glyf");
      local_448._0_4_ = sVar54;
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x20) = sVar54;
      sVar54 = stbtt__find_table(pbVar100,sVar57,"hhea");
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x24) = sVar54;
      sVar55 = stbtt__find_table(pbVar100,sVar57,"hmtx");
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x28) = sVar55;
      sVar56 = stbtt__find_table(pbVar100,sVar57,"kern");
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x2c) = sVar56;
      sVar56 = stbtt__find_table(pbVar100,sVar57,"GPOS");
      *(stbtt_uint32 *)((long)pvVar65 + lVar82 + 0x30) = sVar56;
      bVar101 = false;
      if (((sVar52 == 0) || (sVar53 == 0)) || ((sVar54 == 0 || (sVar55 == 0)))) goto LAB_001335bc;
      local_460 = CONCAT44(local_460._4_4_,sVar53);
      if (local_448._0_4_ == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_498._0_8_ = local_498._0_8_ & 0xffffffff00000000;
        local_430._0_4_ = 0;
        local_49c = 0;
        sVar53 = stbtt__find_table(pbVar100,sVar57,"CFF ");
        if (sVar53 != 0) {
          *(undefined8 *)((long)pvVar65 + lVar82 + 0x90) = 0;
          *(undefined8 *)((long)pvVar65 + lVar82 + 0x98) = 0;
          *(undefined8 *)((long)pvVar65 + lVar82 + 0x80) = 0;
          *(undefined8 *)((long)pvVar65 + lVar82 + 0x88) = 0;
          *(byte **)((long)pvVar65 + lVar82 + 0x40) = pbVar100 + sVar53;
          *(undefined8 *)((long)pvVar65 + lVar82 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar65 + lVar82 + 0x40);
          uVar153 = *(undefined8 *)((long)pvVar65 + lVar82 + 0x48);
          local_238[0].cursor = (int)uVar153;
          local_238[0].size = (int)((ulong)uVar153 >> 0x20);
          uVar58 = local_238[0].cursor + 2U;
          if (local_238[0].size < (int)(local_238[0].cursor + 2U)) {
            uVar58 = local_238[0].size;
          }
          if (local_238[0].cursor < -2) {
            uVar58 = local_238[0].size;
          }
          local_238[0].cursor = 0;
          if ((int)uVar58 < local_238[0].size) {
            local_238[0].cursor = (int)local_238[0].data[(int)uVar58];
          }
          if (local_238[0].size < local_238[0].cursor) {
            local_238[0].cursor = local_238[0].size;
          }
          stbtt__cff_get_index(local_238);
          sVar190 = stbtt__cff_get_index(local_238);
          _local_418 = stbtt__cff_index_get(sVar190,0);
          stbtt__cff_get_index(local_238);
          sVar190 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar65 + lVar82 + 0x60) = sVar190;
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x11,1,(stbtt_uint32 *)local_498);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x106,1,(stbtt_uint32 *)&local_3a8);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x124,1,(stbtt_uint32 *)&local_430);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x125,1,&local_49c);
          uVar153 = local_238[0]._8_8_;
          sVar190._4_12_ = in_stack_fffffffffffffb0c;
          sVar190.data._0_4_ = in_stack_fffffffffffffb08;
          fontdict.cursor = sVar52;
          fontdict.data = (uchar *)pIVar191;
          fontdict.size = iVar80;
          sVar190 = stbtt__get_subrs(sVar190,fontdict);
          sVar53 = local_49c;
          *(stbtt__buf *)((long)pvVar65 + lVar82 + 0x70) = sVar190;
          if (((stbtt_uint32)local_3a8 == 2) && (uVar151 = local_498._0_4_, local_498._0_4_ != 0)) {
            sVar54 = SUB84(uVar153,4);
            if ((stbtt_uint32)local_430 != 0) {
              uVar81 = (ulong)local_49c;
              if (uVar81 == 0) goto LAB_001335ef;
              sVar55 = (stbtt_uint32)local_430;
              if ((int)sVar54 < (int)(stbtt_uint32)local_430) {
                sVar55 = sVar54;
              }
              if ((int)(stbtt_uint32)local_430 < 0) {
                sVar55 = sVar54;
              }
              local_238[0].cursor = sVar55;
              sVar190 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar65 + lVar82 + 0x80) = sVar190;
              puVar64 = local_238[0].data + uVar81;
              lVar63 = (ulong)(local_238[0].size - sVar53) << 0x20;
              if ((int)(local_238[0].size - sVar53 | sVar53) < 0 || local_238[0].size < (int)sVar53)
              {
                puVar64 = (uchar *)0x0;
                lVar63 = 0;
              }
              *(uchar **)((long)pvVar65 + lVar82 + 0x90) = puVar64;
              *(long *)((long)pvVar65 + lVar82 + 0x98) = lVar63;
              sVar54 = local_238[0].size;
            }
            auVar131._8_8_ = 0;
            auVar131._0_8_ = local_4b8._8_8_;
            local_4b8 = auVar131 << 0x40;
            sVar53 = uVar151;
            if ((int)sVar54 < (int)uVar151) {
              sVar53 = sVar54;
            }
            if ((int)uVar151 < 0) {
              sVar53 = sVar54;
            }
            local_238[0].cursor = sVar53;
            sVar190 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar65 + lVar82 + 0x50) = sVar190;
            goto LAB_001307ba;
          }
        }
        goto LAB_001335ef;
      }
      if (local_47c == 0.0) goto LAB_001335ef;
LAB_001307ba:
      sVar57 = stbtt__find_table(pbVar100,sVar57,"maxp");
      if (sVar57 == 0) {
        uVar58 = 0xffff;
      }
      else {
        uVar58 = (uint)(ushort)(*(ushort *)(pbVar100 + (ulong)sVar57 + 4) << 8 |
                               *(ushort *)(pbVar100 + (ulong)sVar57 + 4) >> 8);
      }
      *(uint *)((long)pvVar65 + lVar82 + 0x14) = uVar58;
      uVar49 = *(ushort *)(pbVar100 + (ulong)sVar52 + 2) << 8 |
               *(ushort *)(pbVar100 + (ulong)sVar52 + 2) >> 8;
      *(undefined4 *)((long)pvVar65 + lVar82 + 0x34) = 0;
      iVar80 = 0;
      bVar101 = false;
      if (uVar49 == 0) goto LAB_001335bc;
      uVar58 = sVar52 + 4;
      uVar81 = (ulong)uVar49;
      do {
        uVar49 = *(ushort *)(pbVar100 + uVar58) << 8 | *(ushort *)(pbVar100 + uVar58) >> 8;
        if ((uVar49 == 0) ||
           ((uVar49 == 3 &&
            ((uVar49 = *(ushort *)(pbVar100 + (ulong)uVar58 + 2) << 8 |
                       *(ushort *)(pbVar100 + (ulong)uVar58 + 2) >> 8, uVar49 == 10 || (uVar49 == 1)
             ))))) {
          uVar97 = *(uint *)(pbVar100 + (ulong)uVar58 + 4);
          iVar80 = (uVar97 >> 0x18 | (uVar97 & 0xff0000) >> 8 | (uVar97 & 0xff00) << 8 |
                   uVar97 << 0x18) + sVar52;
          *(int *)((long)pvVar65 + lVar82 + 0x34) = iVar80;
        }
        uVar58 = uVar58 + 8;
        uVar81 = uVar81 - 1;
      } while (uVar81 != 0);
      if (iVar80 == 0) goto LAB_001335ef;
      *(uint *)((long)pvVar65 + lVar82 + 0x38) =
           (uint)(ushort)(*(ushort *)(pbVar100 + (long)(int)(float)local_460 + 0x32) << 8 |
                         *(ushort *)(pbVar100 + (long)(int)(float)local_460 + 0x32) >> 8);
      pIVar74 = pIVar191->GlyphRanges;
      if (pIVar74 == (ImWchar *)0x0) {
        pIVar74 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar65 + lVar82 + 0xd8) = pIVar74;
      IVar6 = *pIVar74;
      while (IVar6 != 0) {
        uVar49 = pIVar74[1];
        if (uVar49 == 0) break;
        uVar58 = *(uint *)((long)pvVar65 + lVar82 + 0xe4);
        uVar97 = (uint)uVar49;
        if ((int)(uint)uVar49 < (int)uVar58) {
          uVar97 = uVar58;
        }
        *(uint *)((long)pvVar65 + lVar82 + 0xe4) = uVar97;
        IVar6 = pIVar74[2];
        pIVar74 = pIVar74 + 2;
      }
      piVar62 = (int *)((long)*(int *)((long)pvVar65 + lVar82 + 0xe0) * 0x20 + (long)pvVar61);
      *piVar62 = *piVar62 + 1;
      iVar80 = *(int *)((long)pvVar65 + lVar82 + 0xe4);
      if (iVar80 < piVar62[1]) {
        iVar80 = piVar62[1];
      }
      piVar62[1] = iVar80;
      pvVar91 = (void *)((long)local_398 + 1);
    } while ((long)pvVar91 < (long)((ImVector<ImFontConfig> *)(local_498._8_8_ + 0x68))->Size);
  }
  local_4b8._0_8_ = 0;
  uVar81 = local_478._0_8_;
  if (local_478._0_4_ < 1) {
LAB_00130c2b:
    local_460 = 0;
  }
  else {
    lVar82 = 0;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = local_4b8._8_8_;
    local_4b8 = auVar133 << 0x40;
    do {
      local_478._0_8_ = lVar82;
      lVar82 = lVar82 * 0x110;
      pvVar61 = (void *)((long)*(int *)((long)pvVar65 + lVar82 + 0xe0) * 0x20 + (long)pvStack_3d0);
      ImBitVector::Create((ImBitVector *)((long)pvVar65 + lVar82 + 0xf0),
                          *(int *)((long)pvVar65 + lVar82 + 0xe4) + 1);
      if (*(int *)((long)pvVar61 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar61 + 0x10),*(int *)((long)pvVar61 + 4) + 1);
      }
      puVar75 = *(ushort **)((long)pvVar65 + lVar82 + 0xd8);
      uVar49 = *puVar75;
      for (; (uVar49 != 0 && (uVar112 = puVar75[1], uVar112 != 0)); puVar75 = puVar75 + 2) {
        if (uVar49 <= uVar112) {
          uVar58 = (uint)uVar49;
          lVar63 = *(long *)((long)pvVar61 + 0x18);
          do {
            auVar117 = local_4b8;
            uVar97 = 1 << ((byte)uVar58 & 0x1f);
            if (((*(uint *)(lVar63 + (ulong)(uVar58 >> 5) * 4) >> (uVar58 & 0x1f) & 1) == 0) &&
               (iVar80 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar65 + lVar82 + 8),
                                    *(int *)((long)pvVar65 + lVar82 + 0x34)), iVar80 != 0)) {
              piVar62 = (int *)((long)pvVar65 + lVar82 + 0xe8);
              *piVar62 = *piVar62 + 1;
              *(int *)((long)pvVar61 + 8) = *(int *)((long)pvVar61 + 8) + 1;
              uVar81 = (ulong)((uVar58 >> 5) << 2);
              puVar88 = (uint *)(*(long *)((long)pvVar65 + lVar82 + 0xf8) + uVar81);
              *puVar88 = *puVar88 | uVar97;
              puVar88 = (uint *)(lVar63 + uVar81);
              *puVar88 = *puVar88 | uVar97;
              iVar80 = local_4b8._0_4_;
              local_4b8._4_4_ = 0;
              local_4b8._0_4_ = iVar80 + 1;
              local_4b8._8_8_ = auVar117._8_8_;
            }
            uVar58 = uVar58 + 1;
          } while (uVar112 + 1 != uVar58);
        }
        uVar49 = puVar75[2];
      }
      lVar82 = local_478._0_8_ + 1;
      uVar81 = (ulong)(int)local_408;
    } while (lVar82 < (long)uVar81);
    local_460 = CONCAT71((int7)((ulong)lVar82 >> 8),0 < (int)local_408);
    if ((int)local_408 < 1) goto LAB_00130c2b;
    uVar96 = 0;
    do {
      lVar82 = uVar96 * 0x110;
      iVar80 = *(int *)((long)pvVar65 + lVar82 + 0xe8);
      if (*(int *)((long)pvVar65 + lVar82 + 0x104) < iVar80) {
        pvVar91 = ImGui::MemAlloc((long)iVar80 << 2);
        pvVar61 = *(void **)((long)pvVar65 + lVar82 + 0x108);
        if (pvVar61 != (void *)0x0) {
          memcpy(pvVar91,pvVar61,(long)*(int *)((long)pvVar65 + lVar82 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar65 + lVar82 + 0x108));
        }
        *(void **)((long)pvVar65 + lVar82 + 0x108) = pvVar91;
        *(int *)((long)pvVar65 + lVar82 + 0x104) = iVar80;
      }
      lVar63 = (long)*(int *)((long)pvVar65 + lVar82 + 0xf0);
      puVar88 = *(uint **)((long)pvVar65 + lVar82 + 0xf8);
      if (0 < lVar63) {
        local_448._0_8_ = uVar96;
        local_478._0_8_ = uVar81;
        puVar1 = puVar88 + lVar63;
        iVar80 = 0;
        do {
          uVar151 = SUB84(puVar88,0);
          uVar175 = (undefined4)((ulong)puVar88 >> 0x20);
          uVar58 = *puVar88;
          if (uVar58 != 0) {
            uVar97 = 0;
            do {
              if ((uVar58 >> (uVar97 & 0x1f) & 1) != 0) {
                iVar93 = *(int *)((long)pvVar65 + lVar82 + 0x100);
                if (iVar93 == *(int *)((long)pvVar65 + lVar82 + 0x104)) {
                  if (iVar93 == 0) {
                    iVar59 = 8;
                  }
                  else {
                    iVar59 = iVar93 / 2 + iVar93;
                  }
                  iVar60 = iVar93 + 1;
                  if (iVar93 + 1 < iVar59) {
                    iVar60 = iVar59;
                  }
                  pvVar61 = ImGui::MemAlloc((long)iVar60 << 2);
                  pvVar91 = *(void **)((long)pvVar65 + lVar82 + 0x108);
                  if (pvVar91 != (void *)0x0) {
                    memcpy(pvVar61,pvVar91,(long)*(int *)((long)pvVar65 + lVar82 + 0x100) << 2);
                    ImGui::MemFree(*(void **)((long)pvVar65 + lVar82 + 0x108));
                  }
                  *(void **)((long)pvVar65 + lVar82 + 0x108) = pvVar61;
                  *(int *)((long)pvVar65 + lVar82 + 0x104) = iVar60;
                  iVar93 = *(int *)((long)pvVar65 + lVar82 + 0x100);
                }
                else {
                  pvVar61 = *(void **)((long)pvVar65 + lVar82 + 0x108);
                }
                *(uint *)((long)pvVar61 + (long)iVar93 * 4) = iVar80 + uVar97;
                piVar62 = (int *)((long)pvVar65 + lVar82 + 0x100);
                *piVar62 = *piVar62 + 1;
              }
              uVar97 = uVar97 + 1;
            } while (uVar97 != 0x20);
          }
          puVar88 = (uint *)(CONCAT44(uVar175,uVar151) + 4);
          iVar80 = iVar80 + 0x20;
        } while (puVar88 < puVar1);
        puVar88 = *(uint **)((long)pvVar65 + lVar82 + 0xf8);
        uVar96 = local_448._0_8_;
        uVar81 = local_478._0_8_;
      }
      if (puVar88 != (uint *)0x0) {
        *(undefined8 *)((long)pvVar65 + lVar82 + 0xf0) = 0;
        ImGui::MemFree(puVar88);
        *(undefined8 *)((long)pvVar65 + lVar82 + 0xf8) = 0;
      }
      uVar96 = uVar96 + 1;
    } while (uVar96 < uVar81);
  }
  pvVar61 = pvStack_3d0;
  atlas_00 = (ImFontAtlas *)local_498._8_8_;
  local_478._0_8_ = uVar81;
  uVar81 = (ulong)(int)local_3d8;
  if ((long)uVar81 < 1) {
    if (pvStack_3d0 != (void *)0x0) goto LAB_00130c8a;
  }
  else {
    puVar68 = (undefined8 *)((long)pvStack_3d0 + 0x18);
    uVar96 = 0;
    do {
      if ((void *)*puVar68 != (void *)0x0) {
        puVar68[-1] = 0;
        ImGui::MemFree((void *)*puVar68);
        *puVar68 = 0;
      }
      uVar96 = uVar96 + 1;
      puVar68 = puVar68 + 4;
    } while (uVar96 < uVar81);
LAB_00130c8a:
    local_3d8 = 0;
    ImGui::MemFree(pvVar61);
    pvStack_3d0 = (void *)0x0;
  }
  _local_418 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  uVar58 = (uint)local_4b8._0_8_;
  if ((int)uVar58 < 1) {
    local_418._0_4_ = uVar58;
    pvVar61 = (void *)0x0;
  }
  else {
    uVar81 = 8;
    if (8 < uVar58) {
      uVar81 = local_4b8._0_8_ & 0xffffffff;
    }
    pvVar61 = ImGui::MemAlloc(uVar81 << 4);
    pvStack_410 = pvVar61;
    local_418._4_4_ = (int)uVar81;
    uVar81 = 8;
    if (8 < uVar58) {
      uVar81 = local_4b8._0_8_ & 0xffffffff;
    }
    local_418._0_4_ = uVar58;
    pvStack_3a0 = ImGui::MemAlloc(uVar81 * 0x1c);
    local_3a8 = uVar81 << 0x20;
  }
  pvVar91 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar58);
  iVar80 = 0;
  memset(pvVar61,0,(long)(int)(uVar58 << 4));
  memset(pvVar91,0,(long)(int)(uVar58 * 0x1c));
  fVar116 = 0.0;
  if ((char)local_460 != '\0') {
    uVar81 = (ulong)(uint)local_478._0_4_;
    uVar96 = 0;
    iVar59 = 0;
    iVar93 = 0;
    uVar151 = 0;
    uVar58 = local_478._0_4_;
    local_398 = pvVar91;
    do {
      iVar60 = *(int *)((long)pvVar65 + uVar96 * 0x110 + 0xe8);
      if (iVar60 != 0) {
        psVar99 = (stbtt_fontinfo *)(uVar96 * 0x110 + (long)pvVar65);
        *(void **)&psVar99[1].hmtx = (void *)((long)iVar59 * 0x10 + (long)pvVar61);
        pvVar84 = (void *)((long)iVar93 * 0x1c + (long)pvVar91);
        *(void **)&psVar99[1].gpos = pvVar84;
        pIVar191 = (atlas_00->ConfigData).Data;
        fVar116 = pIVar191[uVar96].SizePixels;
        *(float *)&psVar99[1].userdata = fVar116;
        *(undefined4 *)((long)&psVar99[1].userdata + 4) = 0;
        psVar99[1].data = *(uchar **)&psVar99[1].gsubrs.cursor;
        iVar94 = *(int *)&psVar99[1].gsubrs.data;
        psVar99[1].fontstart = iVar94;
        *(void **)&psVar99[1].loca = pvVar84;
        *(char *)&psVar99[1].glyf = (char)pIVar191[uVar96].OversampleH;
        *(char *)((long)&psVar99[1].glyf + 1) = (char)pIVar191[uVar96].OversampleV;
        if (fVar116 <= 0.0) {
          fVar116 = -fVar116;
          uVar97 = (uint)(ushort)(*(ushort *)(psVar99->data + (long)psVar99->head + 0x12) << 8 |
                                 *(ushort *)(psVar99->data + (long)psVar99->head + 0x12) >> 8);
        }
        else {
          puVar64 = psVar99->data;
          lVar82 = (long)psVar99->hhea;
          uVar97 = ((int)(short)((ushort)puVar64[lVar82 + 4] << 8) | (uint)puVar64[lVar82 + 5]) -
                   ((int)(short)((ushort)puVar64[lVar82 + 6] << 8) | (uint)puVar64[lVar82 + 7]);
          uVar81 = CONCAT44(uVar151,uVar58);
        }
        fVar116 = fVar116 / (float)(int)uVar97;
        iVar59 = iVar59 + iVar60;
        iVar93 = iVar93 + iVar60;
        atlas_00 = (ImFontAtlas *)local_498._8_8_;
        if (0 < iVar94) {
          local_448._0_4_ = iVar93;
          iVar93 = *(int *)(local_498._8_8_ + 0x14);
          lVar82 = 6;
          lVar63 = 0;
          uVar87 = uVar96;
          do {
            iVar60 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar99->data,psVar99->index_map);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar99,iVar60,(float)pIVar191[uVar96].OversampleH * fVar116,
                       (float)pIVar191[uVar96].OversampleV * fVar116,fVar116,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_498,(int *)&local_430,(int *)&local_49c);
            uVar97 = (pIVar191[uVar96].OversampleH +
                     (((stbtt_uint32)local_430 + iVar93) - (int)local_238[0].data)) - 1;
            lVar78 = *(long *)&psVar99[1].hmtx;
            *(short *)(lVar78 + -2 + lVar82) = (short)uVar97;
            uVar77 = (pIVar191[uVar96].OversampleV + ((local_49c + iVar93) - local_498._0_4_)) - 1;
            *(short *)(lVar78 + lVar82) = (short)uVar77;
            iVar80 = iVar80 + (uVar77 & 0xffff) * (uVar97 & 0xffff);
            lVar63 = lVar63 + 1;
            lVar82 = lVar82 + 0x10;
          } while (lVar63 < *(int *)&psVar99[1].gsubrs.data);
          uVar81 = CONCAT44(uVar151,uVar58);
          uVar96 = uVar87;
          atlas_00 = (ImFontAtlas *)local_498._8_8_;
          pvVar91 = local_398;
          iVar93 = local_448._0_4_;
        }
      }
      uVar96 = uVar96 + 1;
    } while (uVar96 < uVar81);
    fVar116 = (float)iVar80;
  }
  atlas_00->TexHeight = 0;
  iVar80 = atlas_00->TexDesiredWidth;
  if (iVar80 < 1) {
    iVar93 = (int)SQRT(fVar116);
    iVar80 = 0x1000;
    if ((iVar93 < 0xb33) && (iVar80 = 0x800, iVar93 < 0x599)) {
      iVar80 = (uint)(0x2cb < iVar93) * 0x200 + 0x200;
    }
  }
  atlas_00->TexWidth = iVar80;
  local_4a0 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar58 = iVar80 - local_4a0;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar58 << 4);
  auVar131 = _DAT_0017ec30;
  auVar117 = _DAT_0017b730;
  if ((ptr == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    ptr_00 = (stbrp_node *)0x0;
    local_4a0 = 0;
    iVar80 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if ((int)uVar58 < 2) {
      uVar81 = 0;
    }
    else {
      uVar81 = (ulong)(uVar58 - 1);
      uVar96 = (ulong)(uVar58 & 0x7ffffffe);
      lVar82 = uVar81 - 1;
      auVar103._8_4_ = (int)lVar82;
      auVar103._0_8_ = lVar82;
      auVar103._12_4_ = (int)((ulong)lVar82 >> 0x20);
      ppsVar89 = &ptr_00[1].next;
      auVar103 = auVar103 ^ _DAT_0017b730;
      auVar128._8_4_ = 0xffffffff;
      auVar128._0_8_ = 0xffffffffffffffff;
      auVar128._12_4_ = 0xffffffff;
      auVar165 = _DAT_0017ec20;
      do {
        auVar133 = auVar165 ^ auVar117;
        auVar142._0_4_ = -(uint)(auVar103._0_4_ < auVar133._0_4_);
        auVar142._4_4_ = -(uint)(auVar103._4_4_ < auVar133._4_4_);
        auVar142._8_4_ = -(uint)(auVar103._8_4_ < auVar133._8_4_);
        auVar142._12_4_ = -(uint)(auVar103._12_4_ < auVar133._12_4_);
        auVar134._4_4_ = -(uint)(auVar133._4_4_ == auVar103._4_4_);
        auVar134._12_4_ = -(uint)(auVar133._12_4_ == auVar103._12_4_);
        auVar134._0_4_ = auVar134._4_4_;
        auVar134._8_4_ = auVar134._12_4_;
        auVar143._4_4_ = auVar142._4_4_;
        auVar143._0_4_ = auVar142._4_4_;
        auVar143._8_4_ = auVar142._12_4_;
        auVar143._12_4_ = auVar142._12_4_;
        auVar143 = auVar143 | auVar134 & auVar142;
        lVar82 = auVar165._8_8_;
        if ((~auVar143._0_4_ & 1) != 0) {
          ppsVar89[-2] = ptr_00 + auVar165._0_8_ + 1;
        }
        if (((auVar143 ^ auVar128) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar89 = ptr_00 + (lVar82 - auVar128._8_8_);
        }
        auVar165._0_8_ = auVar165._0_8_ + auVar131._0_8_;
        auVar165._8_8_ = lVar82 + auVar131._8_8_;
        ppsVar89 = ppsVar89 + 4;
        uVar96 = uVar96 - 2;
      } while (uVar96 != 0);
    }
    ptr_00[uVar81].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = ptr_00;
    ptr->active_head = ptr->extra;
    ptr->width = uVar58;
    ptr->height = 0x8000 - local_4a0;
    ptr->num_nodes = uVar58;
    ptr->align = (int)((uVar58 - 1) + uVar58) / (int)uVar58;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar58;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_340 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if ((char)local_460 != '\0') {
    uVar81 = (ulong)(uint)local_478._0_4_;
    uVar96 = 0;
    do {
      lVar82 = uVar96 * 0x110;
      iVar93 = *(int *)((long)pvVar65 + lVar82 + 0xe8);
      if (iVar93 != 0) {
        stbrp_pack_rects(local_340,*(stbrp_rect **)((long)pvVar65 + lVar82 + 200),iVar93);
        lVar63 = (long)*(int *)((long)pvVar65 + lVar82 + 0xe8);
        if (0 < lVar63) {
          lVar82 = *(long *)((long)pvVar65 + lVar82 + 200);
          lVar78 = 0;
          do {
            if (*(int *)(lVar82 + 0xc + lVar78) != 0) {
              iVar93 = (uint)*(ushort *)(lVar82 + 6 + lVar78) +
                       (uint)*(ushort *)(lVar82 + 10 + lVar78);
              if (iVar93 < atlas_00->TexHeight) {
                iVar93 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar93;
            }
            lVar78 = lVar78 + 0x10;
          } while (lVar63 * 0x10 != lVar78);
        }
      }
      uVar96 = uVar96 + 1;
    } while (uVar96 < uVar81);
  }
  uVar58 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar58 = (int)(uVar58 - 1) >> 1 | uVar58 - 1;
    uVar58 = (int)uVar58 >> 2 | uVar58;
    uVar58 = (int)uVar58 >> 4 | uVar58;
    uVar58 = (int)uVar58 >> 8 | uVar58;
    uVar58 = (int)uVar58 >> 0x10 | uVar58;
  }
  iVar93 = uVar58 + 1;
  atlas_00->TexHeight = iVar93;
  auVar104._0_4_ = (float)atlas_00->TexWidth;
  auVar104._4_4_ = (float)iVar93;
  auVar104._8_8_ = 0;
  auVar117 = divps(_DAT_0017b750,auVar104);
  atlas_00->TexUvScale = auVar117._0_8_;
  puVar64 = (uchar *)ImGui::MemAlloc((long)(iVar93 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar64;
  local_454 = iVar80;
  local_300 = ptr_00;
  memset(puVar64,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if ((char)local_460 != '\0') {
    local_388 = atlas_00->TexPixelsAlpha8;
    lVar63 = (long)local_454;
    local_298 = pshuflw(ZEXT416(local_4a0),ZEXT416(local_4a0),0);
    lVar82 = 0;
    auVar133 = _DAT_0017b730;
    auVar131 = _DAT_0017ec00;
    auVar117 = _DAT_0017ebd0;
    do {
      local_338 = lVar82;
      if (*(int *)((long)pvStack_400 + lVar82 * 0x110 + 0xe8) != 0) {
        psVar99 = (stbtt_fontinfo *)((long)pvStack_400 + lVar82 * 0x110);
        fVar116 = *(float *)&psVar99[1].userdata;
        if (fVar116 <= 0.0) {
          auVar124._4_4_ = auVar133._4_4_;
          auVar124._0_4_ = (uint)fVar116 ^ auVar133._0_4_;
          auVar124._8_4_ = auVar133._8_4_;
          auVar124._12_4_ = auVar133._12_4_;
          uVar58 = (uint)(ushort)(*(ushort *)(psVar99->data + (long)psVar99->head + 0x12) << 8 |
                                 *(ushort *)(psVar99->data + (long)psVar99->head + 0x12) >> 8);
        }
        else {
          puVar64 = psVar99->data;
          lVar82 = (long)psVar99->hhea;
          uVar58 = ((int)(short)((ushort)puVar64[lVar82 + 4] << 8) | (uint)puVar64[lVar82 + 5]) -
                   ((int)(short)((ushort)puVar64[lVar82 + 6] << 8) | (uint)puVar64[lVar82 + 7]);
          auVar124 = ZEXT416((uint)fVar116);
        }
        local_318._4_12_ = auVar124._4_12_;
        local_318._0_4_ = auVar124._0_4_ / (float)(int)uVar58;
        local_2f8 = (atlas_00->ConfigData).Data;
        iVar80 = psVar99[1].fontstart;
        if (0 < iVar80) {
          lVar82._0_4_ = psVar99[1].hmtx;
          lVar82._4_4_ = psVar99[1].kern;
          uVar81._0_4_ = psVar99[1].glyf;
          uVar81._4_4_ = psVar99[1].hhea;
          auVar24._8_6_ = 0;
          auVar24._0_8_ = uVar81;
          auVar24[0xe] = (char)((uint)uVar81._4_4_ >> 0x18);
          auVar26._8_4_ = 0;
          auVar26._0_8_ = uVar81;
          auVar26[0xc] = (char)((uint)uVar81._4_4_ >> 0x10);
          auVar26._13_2_ = auVar24._13_2_;
          auVar27._8_4_ = 0;
          auVar27._0_8_ = uVar81;
          auVar27._12_3_ = auVar26._12_3_;
          auVar28._8_2_ = 0;
          auVar28._0_8_ = uVar81;
          auVar28[10] = (char)((uint)uVar81._4_4_ >> 8);
          auVar28._11_4_ = auVar27._11_4_;
          auVar31._8_2_ = 0;
          auVar31._0_8_ = uVar81;
          auVar31._10_5_ = auVar28._10_5_;
          auVar32[8] = (char)uVar81._4_4_;
          auVar32._0_8_ = uVar81;
          auVar32._9_6_ = auVar31._9_6_;
          auVar35._7_8_ = 0;
          auVar35._0_7_ = auVar32._8_7_;
          cVar113 = (char)((uint)(undefined4)uVar81 >> 0x18);
          Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),cVar113);
          auVar43._9_6_ = 0;
          auVar43._0_9_ = Var36;
          cVar111 = (char)((uint)(undefined4)uVar81 >> 0x10);
          auVar33[4] = cVar111;
          auVar33._0_4_ = (undefined4)uVar81;
          auVar33._5_10_ = SUB1510(auVar43 << 0x30,5);
          auVar37._11_4_ = 0;
          auVar37._0_11_ = auVar33._4_11_;
          cVar110 = (char)((uint)(undefined4)uVar81 >> 8);
          auVar38._1_12_ = SUB1512(auVar37 << 0x20,3);
          auVar38[0] = cVar110;
          bVar102 = (byte)(undefined4)uVar81;
          uVar49 = CONCAT11(0,bVar102);
          auVar34._2_13_ = auVar38;
          auVar34._0_2_ = uVar49;
          uVar112 = auVar38._0_2_;
          sVar71 = -auVar33._4_2_;
          sVar114 = (short)Var36;
          sVar51 = -sVar114;
          local_488 = (ulong)uVar112;
          auVar25._10_2_ = 0;
          auVar25._0_10_ = auVar34._0_10_;
          auVar25._12_2_ = sVar114;
          uVar45 = CONCAT42(auVar25._10_4_,auVar33._4_2_);
          auVar39._6_8_ = 0;
          auVar39._0_6_ = uVar45;
          auVar29._4_2_ = uVar112;
          auVar29._0_4_ = auVar34._0_4_;
          auVar29._6_8_ = SUB148(auVar39 << 0x40,6);
          auVar105._0_4_ = (float)uVar49;
          auVar105._4_4_ = (float)auVar29._4_4_;
          auVar105._8_4_ = (float)(int)uVar45;
          auVar105._12_4_ = (float)(auVar25._10_4_ >> 0x10);
          local_268 = divps(_DAT_0017b750,auVar105);
          auVar135[0] = -(bVar102 == 0);
          auVar135[1] = -(bVar102 == 0);
          auVar135[2] = -(bVar102 == 0);
          auVar135[3] = -(bVar102 == 0);
          auVar135[4] = -(cVar110 == '\0');
          auVar135[5] = -(cVar110 == '\0');
          auVar135[6] = -(cVar110 == '\0');
          auVar135[7] = -(cVar110 == '\0');
          auVar135[8] = -(cVar111 == '\0');
          auVar135[9] = -(cVar111 == '\0');
          auVar135[10] = -(cVar111 == '\0');
          auVar135[0xb] = -(cVar111 == '\0');
          auVar135[0xc] = -(cVar113 == '\0');
          auVar135[0xd] = -(cVar113 == '\0');
          auVar135[0xe] = -(cVar113 == '\0');
          auVar135[0xf] = -(cVar113 == '\0');
          Var44 = CONCAT64(CONCAT42(CONCAT22(sVar51,sVar51),sVar71),CONCAT22(sVar71,sVar51));
          auVar40._4_8_ = (long)((unkuint10)Var44 >> 0x10);
          auVar40._2_2_ = 1 - uVar112;
          auVar40._0_2_ = 1 - uVar112;
          auVar118._0_4_ = (float)(int)(short)(1 - uVar49);
          auVar118._4_4_ = (float)(auVar40._0_4_ >> 0x10);
          auVar118._8_4_ = (float)((int)((unkuint10)Var44 >> 0x10) >> 0x10);
          auVar118._12_4_ = (float)(int)sVar51;
          auVar129._0_4_ = (float)local_318._0_4_ * auVar105._0_4_;
          auVar129._4_4_ = (float)local_318._0_4_ * auVar105._4_4_;
          auVar129._8_4_ = (float)local_318._0_4_ * auVar105._8_4_;
          auVar129._12_4_ = (float)local_318._0_4_ * auVar105._12_4_;
          auVar106._0_4_ = auVar105._0_4_ + auVar105._0_4_;
          auVar106._4_4_ = auVar105._4_4_ + auVar105._4_4_;
          auVar106._8_4_ = auVar105._8_4_ + auVar105._8_4_;
          auVar106._12_4_ = auVar105._12_4_ + auVar105._12_4_;
          auVar133 = divps(auVar118,auVar106);
          fVar116 = auVar129._4_4_;
          if (auVar129._0_4_ <= auVar129._4_4_) {
            fVar116 = auVar129._0_4_;
          }
          local_3dc = (0.35 / fVar116) * (0.35 / fVar116);
          local_2b8 = auVar129._4_4_;
          fStack_2b4 = auVar129._4_4_;
          fStack_2b0 = auVar129._4_4_;
          fStack_2ac = auVar129._4_4_;
          uVar58 = (uint)auVar129._4_4_ ^ (uint)DAT_0017b730;
          local_328 = (ulong)((undefined4)uVar81 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar81 >> 8 & 0xff);
          auVar125._4_4_ = local_268._4_4_;
          auVar125._0_4_ = auVar125._4_4_;
          auVar125._8_4_ = auVar125._4_4_;
          auVar125._12_4_ = auVar125._4_4_;
          local_278 = auVar125;
          local_258 = ~auVar135 & auVar133;
          local_288._4_4_ = SUB164(~auVar135 & auVar133,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_3e8 = (ulong)(auVar34._0_4_ & 0xff);
          local_2a8 = auVar129;
          local_248._4_4_ = uVar58;
          local_248._0_4_ = auVar129._0_4_;
          fStack_240 = auVar129._0_4_;
          fStack_23c = (float)uVar58;
          lVar78 = 0;
          local_2d8 = lVar82;
          local_3c0 = psVar99;
          auVar133 = _DAT_0017b730;
          do {
            fVar116 = auVar125._0_4_;
            if (*(int *)(lVar82 + 0xc + lVar78 * 0x10) != 0) {
              lVar76 = lVar78 * 0x10 + lVar82;
              sVar71 = *(short *)(lVar76 + 4);
              if ((sVar71 != 0) && (sVar51 = *(short *)(lVar76 + 6), sVar51 != 0)) {
                local_2d0 = (short *)(lVar78 * 0x1c + *(long *)&psVar99[1].loca);
                info = (stbtt_fontinfo *)psVar99->data;
                local_3b0 = lVar76;
                local_2c8 = lVar78;
                iVar93 = stbtt_FindGlyphIndex(info,psVar99->index_map);
                lVar82 = local_3b0;
                *(uint *)(local_3b0 + 8) =
                     CONCAT22((short)((uint)*(undefined4 *)(local_3b0 + 8) >> 0x10) +
                              local_298._2_2_,
                              (short)*(undefined4 *)(local_3b0 + 8) + local_298._0_2_);
                *(short *)(local_3b0 + 4) = sVar71 - (short)local_4a0;
                *(short *)(local_3b0 + 6) = sVar51 - (short)local_4a0;
                uVar49 = *(ushort *)((long)&info->glyf + (long)psVar99->hhea + 2);
                uVar49 = uVar49 << 8 | uVar49 >> 8;
                iVar80 = psVar99->hmtx;
                pbVar90 = (byte *)((long)info + (ulong)uVar49 * 4 + (long)iVar80 + -4);
                pbVar100 = (byte *)((long)info + (ulong)uVar49 * 4 + (long)iVar80 + -3);
                if (iVar93 < (int)(uint)uVar49) {
                  pbVar90 = (byte *)((long)&info->userdata + (long)(iVar93 * 4) + (long)iVar80);
                  pbVar100 = (byte *)((long)&info->userdata + (long)(iVar93 * 4) + 1 + (long)iVar80)
                  ;
                }
                local_358 = (uint)*pbVar100;
                local_354 = (uint)*pbVar90;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar99,iVar93,(float)local_2a8._0_4_,local_2b8,fVar116,auVar129._0_4_,
                           &local_348,&local_34c,&local_2bc,&local_2c0);
                uVar49 = *(ushort *)(lVar82 + 8);
                local_370 = (uchar *)(ulong)*(ushort *)(lVar82 + 10);
                local_438 = (ulong)*(ushort *)(lVar82 + 4);
                local_3f8 = (ulong)*(ushort *)(lVar82 + 6);
                uVar58 = stbtt_GetGlyphShape(psVar99,iVar93,(stbtt_vertex **)&local_430);
                fVar98 = (float)(((int)local_438 - (int)local_3e8) + 1);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_3c0,iVar93,(float)local_2a8._0_4_,local_2b8,fVar116,auVar129._0_4_,
                           (int *)&local_49c,&local_344,(int *)0x0,(int *)0x0);
                sVar57 = local_49c;
                local_47c = fVar98;
                if (fVar98 != 0.0) {
                  iVar80 = ((int)local_3f8 - (int)local_488) + 1;
                  if ((iVar80 != 0) && (0 < (int)uVar58)) {
                    local_370 = local_388 + (long)local_370 * lVar63 + (ulong)uVar49;
                    local_438 = (ulong)(uint)((int)local_438 - (int)local_3e8);
                    local_3f8 = (ulong)(uint)((int)local_3f8 - (int)local_488);
                    lVar82 = CONCAT44(local_430._4_4_,(stbtt_uint32)local_430);
                    local_424 = local_344;
                    lVar78 = 0;
                    uVar97 = 0;
                    do {
                      uVar97 = uVar97 + (*(char *)(lVar82 + 0xc + lVar78) == '\x01');
                      lVar78 = lVar78 + 0xe;
                    } while ((ulong)uVar58 * 0xe != lVar78);
                    if (uVar97 != 0) {
                      uVar151 = 0;
                      local_450 = ImGui::MemAlloc((ulong)uVar97 * 4);
                      if (local_450 != (void *)0x0) {
                        bVar70 = false;
                        iVar59 = 0;
                        auVar41._8_8_ = 0;
                        auVar41._0_8_ = local_448._8_8_;
                        local_448 = auVar41 << 0x40;
                        iVar93 = 0;
                        bVar101 = true;
                        do {
                          bVar79 = bVar101;
                          if (bVar70) {
                            pvVar65 = ImGui::MemAlloc((long)iVar93 << 3);
                            local_448._0_8_ = pvVar65;
                            if (pvVar65 == (void *)0x0) {
                              ImGui::MemFree((void *)0x0);
                              ImGui::MemFree(local_450);
                              goto LAB_00132685;
                            }
                          }
                          local_238[0].data =
                               (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                          fVar116 = 0.0;
                          fVar98 = 0.0;
                          uVar81 = 0xffffffff;
                          lVar78 = 0;
                          do {
                            iVar93 = (int)local_238[0].data;
                            switch(*(undefined1 *)(lVar82 + 0xc + lVar78)) {
                            case 1:
                              if (-1 < (int)uVar81) {
                                *(int *)((long)local_450 + uVar81 * 4) =
                                     (int)local_238[0].data - iVar59;
                              }
                              uVar81 = (ulong)((int)uVar81 + 1);
                              auVar117 = pshuflw(ZEXT416(*(uint *)(lVar82 + lVar78)),
                                                 ZEXT416(*(uint *)(lVar82 + lVar78)),0x60);
                              fVar116 = (float)(auVar117._0_4_ >> 0x10);
                              fVar98 = (float)(auVar117._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              iVar59 = iVar93;
                              if ((stbtt__point *)local_448._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(local_448._0_8_ + (long)iVar93 * 8))->x = fVar116;
                                ((stbtt__point *)(local_448._0_8_ + (long)iVar93 * 8))->y = fVar98;
                              }
                              break;
                            case 2:
                              lVar76 = (long)(int)local_238[0].data;
                              auVar117 = pshuflw(ZEXT416(*(uint *)(lVar82 + lVar78)),
                                                 ZEXT416(*(uint *)(lVar82 + lVar78)),0x60);
                              fVar116 = (float)(auVar117._0_4_ >> 0x10);
                              fVar98 = (float)(auVar117._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              if ((stbtt__point *)local_448._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(local_448._0_8_ + lVar76 * 8))->x = fVar116;
                                ((stbtt__point *)(local_448._0_8_ + lVar76 * 8))->y = fVar98;
                              }
                              break;
                            case 3:
                              fVar138 = (float)(int)*(short *)(lVar82 + 6 + lVar78);
                              auVar129 = ZEXT416((uint)fVar138);
                              stbtt__tesselate_curve
                                        ((stbtt__point *)local_448._0_8_,(int *)local_238,fVar116,
                                         fVar98,(float)(int)*(short *)(lVar82 + 4 + lVar78),fVar138,
                                         (float)(int)*(short *)(lVar82 + lVar78),
                                         (float)(int)*(short *)(lVar82 + 2 + lVar78),local_3dc,0);
                              goto LAB_001319e6;
                            case 4:
                              fVar138 = (float)(int)*(short *)(lVar82 + 6 + lVar78);
                              auVar129 = ZEXT416((uint)fVar138);
                              stbtt__tesselate_cubic
                                        ((stbtt__point *)local_448._0_8_,(int *)local_238,fVar116,
                                         fVar98,(float)(int)*(short *)(lVar82 + 4 + lVar78),fVar138,
                                         (float)(int)*(short *)(lVar82 + 8 + lVar78),
                                         (float)(int)*(short *)(lVar82 + 10 + lVar78),
                                         (float)(int)*(short *)(lVar82 + lVar78),
                                         (float)(int)*(short *)(lVar82 + 2 + lVar78),local_3dc,0);
LAB_001319e6:
                              auVar117 = pshuflw(ZEXT416(*(uint *)(lVar82 + lVar78)),
                                                 ZEXT416(*(uint *)(lVar82 + lVar78)),0x60);
                              fVar116 = (float)(auVar117._0_4_ >> 0x10);
                              fVar98 = (float)(auVar117._4_4_ >> 0x10);
                            }
                            lVar78 = lVar78 + 0xe;
                          } while ((ulong)uVar58 * 0xe != lVar78);
                          *(int *)((long)local_450 + (long)(int)uVar81 * 4) =
                               (int)local_238[0].data - iVar59;
                          bVar70 = true;
                          iVar93 = (int)local_238[0].data;
                          bVar101 = false;
                        } while (bVar79);
                        pvVar65 = (void *)local_448._0_8_;
                        if ((void *)local_448._0_8_ != (void *)0x0) {
                          lVar82 = 0;
                          lVar78 = 0;
                          do {
                            lVar78 = (long)(int)lVar78 +
                                     (long)*(int *)((long)local_450 + lVar82 * 4);
                            lVar82 = lVar82 + 1;
                          } while (CONCAT44(uVar151,uVar97) != lVar82);
                          local_468 = (stbtt__edge *)ImGui::MemAlloc(lVar78 * 0x14 + 0x14);
                          if (local_468 != (stbtt__edge *)0x0) {
                            lVar82 = 0;
                            uVar58 = 0;
                            iVar93 = 0;
                            do {
                              iVar59 = *(int *)((long)local_450 + lVar82 * 4);
                              if (0 < iVar59) {
                                lVar78 = local_448._0_8_ + (long)iVar93 * 8;
                                uVar96 = (ulong)(iVar59 - 1);
                                uVar81 = 0;
                                iVar60 = iVar59;
                                do {
                                  iVar94 = (int)uVar96;
                                  fVar116 = *(float *)(lVar78 + 4 + (long)iVar94 * 8);
                                  fVar98 = *(float *)((long)pvVar65 +
                                                     uVar81 * 8 + (long)iVar93 * 8 + 4);
                                  if ((fVar116 != fVar98) || (NAN(fVar116) || NAN(fVar98))) {
                                    iVar95 = (int)uVar81;
                                    iVar60 = iVar94;
                                    if (fVar116 <= fVar98) {
                                      iVar60 = iVar95;
                                      iVar95 = iVar94;
                                    }
                                    local_468[(int)uVar58].invert = (uint)(fVar98 < fVar116);
                                    uVar153 = *(undefined8 *)(lVar78 + (long)iVar60 * 8);
                                    uVar177 = *(undefined8 *)(lVar78 + (long)iVar95 * 8);
                                    psVar85 = local_468 + (int)uVar58;
                                    psVar85->x0 = (float)uVar153 * (float)local_248._0_4_ + 0.0;
                                    psVar85->y0 = (float)((ulong)uVar153 >> 0x20) *
                                                  (float)local_248._4_4_ + 0.0;
                                    psVar85->x1 = (float)uVar177 * fStack_240 + 0.0;
                                    psVar85->y1 = (float)((ulong)uVar177 >> 0x20) * fStack_23c + 0.0
                                    ;
                                    uVar58 = uVar58 + 1;
                                    iVar60 = *(int *)((long)local_450 + lVar82 * 4);
                                  }
                                  uVar96 = uVar81 & 0xffffffff;
                                  uVar81 = uVar81 + 1;
                                } while ((long)uVar81 < (long)iVar60);
                              }
                              iVar93 = iVar93 + iVar59;
                              lVar82 = lVar82 + 1;
                            } while (lVar82 != CONCAT44(uVar151,uVar97));
                            stbtt__sort_edges_quicksort(local_468,uVar58);
                            iVar93 = (int)local_438;
                            if (1 < (int)uVar58) {
                              uVar81 = 1;
                              lVar82 = 2;
                              psVar85 = local_468;
                              do {
                                uVar2 = local_468[uVar81].x0;
                                uVar3 = local_468[uVar81].y0;
                                iVar59 = local_468[uVar81].invert;
                                local_238[0].cursor = iVar59;
                                local_238[0].data = *(uchar **)&local_468[uVar81].x1;
                                lVar78 = lVar82;
                                psVar92 = psVar85;
                                do {
                                  if (psVar92->y0 <= (float)uVar3) {
                                    uVar97 = (int)lVar78 - 1;
                                    goto LAB_00131c44;
                                  }
                                  psVar92[1].invert = psVar92->invert;
                                  fVar116 = psVar92->y0;
                                  fVar98 = psVar92->x1;
                                  fVar138 = psVar92->y1;
                                  psVar92[1].x0 = psVar92->x0;
                                  psVar92[1].y0 = fVar116;
                                  psVar92[1].x1 = fVar98;
                                  psVar92[1].y1 = fVar138;
                                  lVar78 = lVar78 + -1;
                                  psVar92 = psVar92 + -1;
                                } while (1 < lVar78);
                                uVar97 = 0;
LAB_00131c44:
                                if (uVar81 != uVar97) {
                                  local_468[(int)uVar97].x0 = (float)uVar2;
                                  local_468[(int)uVar97].y0 = (float)uVar3;
                                  *(uchar **)&local_468[(int)uVar97].x1 = local_238[0].data;
                                  local_468[(int)uVar97].invert = iVar59;
                                }
                                uVar81 = uVar81 + 1;
                                lVar82 = lVar82 + 1;
                                psVar85 = psVar85 + 1;
                              } while (uVar81 != uVar58);
                            }
                            local_498._0_8_ = (stbtt__active_edge *)0x0;
                            scanline = local_238;
                            if (0x3f < iVar93) {
                              scanline = (stbtt__buf *)
                                         ImGui::MemAlloc((ulong)(uint)local_47c * 8 + 4);
                              iVar93 = (int)local_438;
                            }
                            local_468[(int)uVar58].y0 = (float)(iVar80 + local_424) + 1.0;
                            if ((uint)local_3f8 < 0x7fffffff) {
                              local_2f0 = (long)(int)local_47c;
                              local_350 = (float)(int)sVar57;
                              local_368 = (float *)((long)&scanline->data + local_2f0 * 4);
                              local_330 = local_368 + 1;
                              local_2e0 = local_2f0 * 4;
                              local_2e8 = (long)iVar93 * 4 + 8;
                              local_41c = (float)(int)local_47c;
                              local_380 = 0;
                              psVar69 = (stbtt__active_edge *)0x0;
                              local_378 = 0;
                              local_3b8 = (undefined8 *)0x0;
                              local_420 = 0;
                              local_3f0 = (stbtt__active_edge *)0x0;
                              psVar85 = local_468;
                              iVar80 = local_424;
                              do {
                                local_35c = iVar80;
                                iVar80 = local_424;
                                fVar116 = (float)local_35c;
                                fVar98 = fVar116 + 1.0;
                                memset(scanline,0,local_2e0);
                                memset(local_368,0,local_2e8);
                                if (psVar69 != (stbtt__active_edge *)0x0) {
                                  psVar66 = (stbtt__active_edge *)local_498;
                                  do {
                                    if (psVar69->ey <= fVar116) {
                                      psVar66->next = psVar69->next;
                                      psVar69->direction = 0.0;
                                      psVar69->next = local_3f0;
                                      local_3f0 = psVar69;
                                      psVar69 = psVar66;
                                    }
                                    ppsVar48 = &psVar69->next;
                                    psVar66 = psVar69;
                                    psVar69 = *ppsVar48;
                                  } while (*ppsVar48 != (stbtt__active_edge *)0x0);
                                }
                                fVar138 = psVar85->y0;
                                psVar69 = local_3f0;
                                iVar93 = local_420;
                                if (fVar138 <= fVar98) {
                                  bVar101 = (int)local_378 == 0;
                                  do {
                                    fVar139 = psVar85->y1;
                                    if ((fVar138 != fVar139) || (NAN(fVar138) || NAN(fVar139))) {
                                      if (psVar69 == (stbtt__active_edge *)0x0) {
                                        if (iVar93 == 0) {
                                          puVar68 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                          if (puVar68 == (undefined8 *)0x0) {
                                            psVar69 = (stbtt__active_edge *)0x0;
                                            iVar93 = 0;
                                            goto LAB_001325ee;
                                          }
                                          *puVar68 = local_3b8;
                                          fVar138 = psVar85->y0;
                                          fVar139 = psVar85->y1;
                                          iVar93 = 799;
                                          local_3b8 = puVar68;
                                        }
                                        else {
                                          iVar93 = iVar93 + -1;
                                        }
                                        psVar69 = (stbtt__active_edge *)
                                                  (local_3b8 + (long)iVar93 * 4 + 1);
                                        psVar66 = (stbtt__active_edge *)0x0;
                                      }
                                      else {
                                        psVar66 = psVar69->next;
                                      }
                                      fVar140 = psVar85->x0;
                                      fVar141 = (psVar85->x1 - fVar140) / (fVar139 - fVar138);
                                      psVar69->fdx = fVar141;
                                      psVar69->fdy = (float)(-(uint)(fVar141 != 0.0) &
                                                            (uint)(1.0 / fVar141));
                                      psVar69->fx = ((fVar116 - fVar138) * fVar141 + fVar140) -
                                                    local_350;
                                      psVar69->direction =
                                           *(float *)(&DAT_0017ece0 +
                                                     (ulong)(psVar85->invert == 0) * 4);
                                      psVar69->sy = fVar138;
                                      psVar69->ey = fVar139;
                                      psVar69->next = (stbtt__active_edge *)0x0;
                                      if (fVar139 < fVar116 && (bVar101 && iVar80 != 0)) {
                                        psVar69->ey = fVar116;
                                      }
                                      psVar69->next = (stbtt__active_edge *)local_498._0_8_;
                                      local_498._0_8_ = psVar69;
                                      psVar69 = psVar66;
                                    }
LAB_001325ee:
                                    fVar138 = psVar85[1].y0;
                                    psVar85 = psVar85 + 1;
                                  } while (fVar138 <= fVar98);
                                }
                                local_3f0 = psVar69;
                                local_420 = iVar93;
                                psVar69 = (stbtt__active_edge *)local_498._0_8_;
                                puVar68 = local_3b8;
                                for (psVar66 = (stbtt__active_edge *)local_498._0_8_;
                                    local_498._0_8_ = psVar69, local_3b8 = puVar68,
                                    psVar66 != (stbtt__active_edge *)0x0; psVar66 = psVar66->next) {
                                  fVar138 = psVar66->fx;
                                  fVar139 = psVar66->fdx;
                                  if ((fVar139 != 0.0) || (NAN(fVar139))) {
                                    fVar146 = fVar139 + fVar138;
                                    fVar140 = psVar66->sy;
                                    fVar141 = (float)(~-(uint)(fVar116 < fVar140) & (uint)fVar138 |
                                                     (uint)((fVar140 - fVar116) * fVar139 + fVar138)
                                                     & -(uint)(fVar116 < fVar140));
                                    if (0.0 <= fVar141) {
                                      fVar147 = psVar66->ey;
                                      fVar149 = (float)(-(uint)(fVar147 < fVar98) &
                                                        (uint)((fVar147 - fVar116) * fVar139 +
                                                              fVar138) |
                                                       ~-(uint)(fVar147 < fVar98) & (uint)fVar146);
                                      if (((0.0 <= fVar149) && (fVar141 < local_41c)) &&
                                         (fVar149 < local_41c)) {
                                        if (fVar140 <= fVar116) {
                                          fVar140 = fVar116;
                                        }
                                        iVar80 = (int)fVar141;
                                        if (fVar98 <= fVar147) {
                                          fVar147 = fVar98;
                                        }
                                        iVar93 = (int)fVar149;
                                        if (iVar80 == iVar93) {
                                          lVar82 = (long)iVar80;
                                          *(float *)((long)&scanline->data + lVar82 * 4) =
                                               (((fVar149 - (float)iVar80) +
                                                (fVar141 - (float)iVar80)) * -0.5 + 1.0) *
                                               psVar66->direction * (fVar147 - fVar140) +
                                               *(float *)((long)&scanline->data + lVar82 * 4);
                                          fVar138 = (fVar147 - fVar140) * psVar66->direction;
                                        }
                                        else {
                                          fVar139 = psVar66->fdy;
                                          iVar59 = iVar80;
                                          fVar150 = fVar141;
                                          if (fVar149 < fVar141) {
                                            fVar159 = fVar116 - fVar140;
                                            fVar140 = (fVar116 - fVar147) + fVar98;
                                            fVar139 = -fVar139;
                                            iVar59 = iVar93;
                                            iVar93 = iVar80;
                                            fVar138 = fVar146;
                                            fVar150 = fVar149;
                                            fVar149 = fVar141;
                                            fVar147 = fVar159 + fVar98;
                                          }
                                          iVar80 = iVar59 + 1;
                                          fVar146 = ((float)iVar80 - fVar138) * fVar139 + fVar116;
                                          fVar138 = psVar66->direction;
                                          fVar141 = (fVar146 - fVar140) * fVar138;
                                          lVar82 = (long)iVar59;
                                          *(float *)((long)&scanline->data + lVar82 * 4) =
                                               (((fVar150 - (float)iVar59) + 1.0) * -0.5 + 1.0) *
                                               fVar141 + *(float *)((long)&scanline->data +
                                                                   lVar82 * 4);
                                          if (iVar93 - iVar80 != 0 && iVar80 <= iVar93) {
                                            do {
                                              *(float *)((long)&scanline->data + lVar82 * 4 + 4) =
                                                   fVar139 * fVar138 * 0.5 + fVar141 +
                                                   *(float *)((long)&scanline->data + lVar82 * 4 + 4
                                                             );
                                              fVar141 = fVar141 + fVar139 * fVar138;
                                              lVar82 = lVar82 + 1;
                                            } while (iVar93 + -1 != (int)lVar82);
                                          }
                                          lVar82 = (long)iVar93;
                                          *(float *)((long)&scanline->data + lVar82 * 4) =
                                               (fVar147 -
                                               (fVar139 * (float)(iVar93 - iVar80) + fVar146)) *
                                               (((fVar149 - (float)iVar93) + 0.0) * -0.5 + 1.0) *
                                               fVar138 + fVar141 +
                                               *(float *)((long)&scanline->data + lVar82 * 4);
                                          fVar138 = (fVar147 - fVar140) * fVar138;
                                        }
                                        local_330[lVar82] = fVar138 + local_330[lVar82];
                                        goto LAB_001323a4;
                                      }
                                    }
                                    if ((uint)local_438 < 0x7fffffff) {
                                      local_398 = (void *)(ulong)(uint)fVar138;
                                      uStack_390 = 0;
                                      uStack_38c = 0;
                                      local_460._4_4_ = (undefined4)((ulong)local_460 >> 0x20);
                                      local_460 = CONCAT44(local_460._4_4_,fVar139);
                                      fVar140 = fVar116;
                                      local_478 = ZEXT416((uint)fVar146);
                                      fVar141 = 0.0;
                                      do {
                                        fVar147 = (float)(int)fVar141;
                                        fVar149 = (float)((int)fVar141 + 1);
                                        fVar150 = (float)(int)fVar149;
                                        fVar146 = (fVar147 - fVar138) / fVar139 + fVar140;
                                        fVar139 = (fVar150 - fVar138) / fVar139 + fVar140;
                                        fVar159 = local_478._0_4_;
                                        fVar116 = fVar140;
                                        if ((fVar147 <= fVar138) || (fVar159 <= fVar150)) {
                                          if ((fVar147 <= fVar159) || (fVar138 <= fVar150)) {
                                            if (((fVar147 <= fVar138) || (fVar159 <= fVar147)) &&
                                               ((fVar147 <= fVar159 || (fVar138 <= fVar147)))) {
                                              if (((fVar138 < fVar150) && (fVar150 < fVar159)) ||
                                                 ((fVar147 = fVar138, fVar146 = fVar140,
                                                  fVar159 < fVar150 && (fVar150 < fVar138))))
                                              goto LAB_0013209b;
                                              goto LAB_00132149;
                                            }
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,(int)fVar141,psVar66,
                                                       fVar138,fVar140,fVar150,fVar139);
                                            fVar138 = fVar150;
                                            fVar140 = fVar139;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar66,fVar138,
                                                     fVar140,fVar147,fVar146);
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar66,fVar138,
                                                     fVar140,fVar147,fVar146);
                                          fVar138 = fVar147;
                                          fVar140 = fVar146;
LAB_0013209b:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar66,fVar138,
                                                     fVar140,fVar150,fVar139);
                                          fVar147 = fVar150;
                                          fVar146 = fVar139;
                                        }
LAB_00132149:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,(int)fVar141,psVar66,fVar147,
                                                   fVar146,local_478._0_4_,fVar98);
                                        fVar138 = local_398._0_4_;
                                        fVar140 = fVar116;
                                        fVar139 = (float)local_460;
                                        fVar141 = fVar149;
                                      } while (local_47c != fVar149);
                                    }
                                  }
                                  else if (fVar138 < local_41c) {
                                    if (0.0 <= fVar138) {
                                      local_398 = (void *)(ulong)(uint)fVar138;
                                      uStack_390 = 0;
                                      uStack_38c = 0;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,(int)fVar138,psVar66,fVar138,
                                                 fVar116,fVar138,fVar98);
                                      iVar80 = (int)fVar138 + 1;
                                      fVar138 = local_398._0_4_;
                                    }
                                    else {
                                      iVar80 = 0;
                                    }
                                    stbtt__handle_clipped_edge
                                              (local_368,iVar80,psVar66,fVar138,fVar116,fVar138,
                                               fVar98);
                                  }
LAB_001323a4:
                                  psVar69 = (stbtt__active_edge *)local_498._0_8_;
                                  puVar68 = local_3b8;
                                }
                                uVar58 = (uint)DAT_0017b770;
                                auVar129._0_12_ = ZEXT812(0x437f0000);
                                auVar129._12_4_ = 0.0;
                                psVar66 = psVar69;
                                if ((uint)local_438 < 0x7fffffff) {
                                  fVar116 = 0.0;
                                  psVar67 = scanline;
                                  uVar81 = local_380;
                                  lVar82 = local_2f0;
                                  do {
                                    fVar116 = fVar116 + *(float *)((long)&psVar67->data +
                                                                  local_2f0 * 4);
                                    iVar80 = (int)((float)((uint)(*(float *)&psVar67->data + fVar116
                                                                 ) & uVar58) * 255.0 + 0.5);
                                    uVar83 = (uchar)iVar80;
                                    if (0xfe < iVar80) {
                                      uVar83 = 0xff;
                                    }
                                    local_370[(int)uVar81] = uVar83;
                                    uVar81 = (ulong)((int)uVar81 + 1);
                                    psVar67 = (stbtt__buf *)((long)&psVar67->data + 4);
                                    lVar82 = lVar82 + -1;
                                  } while (lVar82 != 0);
                                }
                                for (; psVar66 != (stbtt__active_edge *)0x0; psVar66 = psVar66->next
                                    ) {
                                  psVar66->fx = psVar66->fdx + psVar66->fx;
                                }
                                iVar93 = (int)local_378;
                                local_378 = (ulong)(iVar93 + 1);
                                local_380 = (ulong)(uint)((int)local_380 + local_454);
                                iVar80 = local_35c + 1;
                              } while (iVar93 != (uint)local_3f8);
                              while (puVar68 != (undefined8 *)0x0) {
                                puVar9 = (undefined8 *)*puVar68;
                                ImGui::MemFree(puVar68);
                                puVar68 = puVar9;
                              }
                            }
                            pvVar65 = (void *)local_448._0_8_;
                            if (scanline != local_238) {
                              ImGui::MemFree(scanline);
                            }
                            ImGui::MemFree(local_468);
                          }
                          ImGui::MemFree(local_450);
                          ImGui::MemFree(pvVar65);
                        }
                      }
                    }
                  }
                }
LAB_00132685:
                ImGui::MemFree((void *)CONCAT44(local_430._4_4_,(stbtt_uint32)local_430));
                uVar81 = (ulong)*(ushort *)(local_3b0 + 8);
                uVar49 = *(ushort *)(local_3b0 + 10);
                uVar112 = *(ushort *)(local_3b0 + 4);
                uVar58 = (uint)uVar112;
                uVar50 = *(ushort *)(local_3b0 + 6);
                iVar80 = (int)local_488;
                auVar131 = _DAT_0017ec00;
                auVar117 = _DAT_0017ebd0;
                if (1 < (byte)local_328) {
                  local_238[0].data = (uchar *)0x0;
                  uVar97 = 0;
                  if (uVar50 == 0) {
                    uVar50 = 0;
                  }
                  else {
                    puVar64 = local_388 +
                              (long)(int)((uint)uVar49 * local_454) +
                              (ulong)*(ushort *)(local_3b0 + 8);
                    iVar80 = (uint)uVar112 - (int)local_3e8;
                    uVar58 = iVar80 + 1;
                    uVar81 = (ulong)uVar58;
                    do {
                      uVar96 = local_328;
                      memset(local_238,0,local_328);
                      auVar131 = _DAT_0017ec00;
                      auVar117 = _DAT_0017ebd0;
                      uVar77 = uVar58;
                      switch((int)uVar96) {
                      case 2:
                        if (iVar80 < 0) {
LAB_00132912:
                          uVar96 = 0;
                          uVar77 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar96 = 0;
                          do {
                            bVar102 = puVar64[uVar87];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 2 & 7)) =
                                 bVar102;
                            uVar72 = (int)uVar96 + ((uint)bVar102 - (uint)bVar4);
                            uVar96 = (ulong)uVar72;
                            puVar64[uVar87] = (uchar)(uVar72 >> 1);
                            uVar87 = uVar87 + 1;
                          } while (uVar81 != uVar87);
                        }
                        break;
                      case 3:
                        if (iVar80 < 0) goto LAB_00132912;
                        uVar87 = 0;
                        uVar96 = 0;
                        do {
                          bVar102 = puVar64[uVar87];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 3 & 7)) =
                               bVar102;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar102 - (uint)bVar4));
                          puVar64[uVar87] = (uchar)(uVar96 / 3);
                          uVar87 = uVar87 + 1;
                        } while (uVar81 != uVar87);
                        break;
                      case 4:
                        if (iVar80 < 0) goto LAB_00132912;
                        uVar87 = 0;
                        uVar96 = 0;
                        do {
                          bVar102 = puVar64[uVar87];
                          uVar86 = (ulong)((uint)uVar87 & 7);
                          bVar4 = *(byte *)((long)&local_238[0].data + uVar86);
                          *(byte *)((long)&local_238[0].data + (uVar86 ^ 4)) = bVar102;
                          uVar72 = (int)uVar96 + ((uint)bVar102 - (uint)bVar4);
                          uVar96 = (ulong)uVar72;
                          puVar64[uVar87] = (uchar)(uVar72 >> 2);
                          uVar87 = uVar87 + 1;
                        } while (uVar81 != uVar87);
                        break;
                      case 5:
                        if (iVar80 < 0) goto LAB_00132912;
                        uVar87 = 0;
                        uVar96 = 0;
                        do {
                          bVar102 = puVar64[uVar87];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 5 & 7)) =
                               bVar102;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar102 - (uint)bVar4));
                          puVar64[uVar87] = (uchar)(uVar96 / 5);
                          uVar87 = uVar87 + 1;
                        } while (uVar81 != uVar87);
                        break;
                      default:
                        if (iVar80 < 0) {
                          uVar96 = 0;
                          uVar77 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar96 = 0;
                          do {
                            bVar102 = puVar64[uVar87];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)((int)local_3e8 + (uint)uVar87 & 7)) = bVar102;
                            uVar96 = (ulong)((int)uVar96 + ((uint)bVar102 - (uint)bVar4));
                            puVar64[uVar87] = (uchar)(uVar96 / (local_3e8 & 0xffffffff));
                            uVar87 = uVar87 + 1;
                          } while (uVar81 != uVar87);
                        }
                      }
                      if ((int)uVar77 < (int)(uint)uVar112) {
                        uVar87 = (ulong)uVar77;
                        do {
                          uVar96 = (ulong)((int)uVar96 -
                                          (uint)*(byte *)((long)&local_238[0].data +
                                                         (ulong)((uint)uVar87 & 7)));
                          puVar64[uVar87] = (uchar)(uVar96 / (local_3e8 & 0xffffffff));
                          uVar87 = uVar87 + 1;
                        } while ((int)uVar87 < (int)(uint)uVar112);
                      }
                      puVar64 = puVar64 + lVar63;
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar50);
                    uVar81 = (ulong)*(ushort *)(local_3b0 + 8);
                    uVar49 = *(ushort *)(local_3b0 + 10);
                    uVar58 = (uint)*(ushort *)(local_3b0 + 4);
                    uVar50 = *(ushort *)(local_3b0 + 6);
                    iVar80 = (int)local_488;
                  }
                }
                sVar71 = (short)uVar81;
                if (1 < (byte)local_320) {
                  local_238[0].data = (uchar *)0x0;
                  uVar97 = 0;
                  if ((short)uVar58 == 0) {
                    uVar58 = 0;
                  }
                  else {
                    pbVar100 = local_388 + (long)(int)((uint)uVar49 * local_454) + uVar81;
                    iVar80 = (uint)uVar50 - iVar80;
                    uVar77 = iVar80 + 1;
                    uVar81 = (ulong)uVar77;
                    do {
                      uVar96 = local_320;
                      memset(local_238,0,local_320);
                      auVar131 = _DAT_0017ec00;
                      auVar117 = _DAT_0017ebd0;
                      uVar72 = uVar77;
                      switch((int)uVar96) {
                      case 2:
                        if (iVar80 < 0) {
LAB_00132cbe:
                          uVar96 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar96 = 0;
                          pbVar90 = pbVar100;
                          do {
                            bVar102 = *pbVar90;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 2 & 7)) =
                                 bVar102;
                            uVar73 = (int)uVar96 + ((uint)bVar102 - (uint)bVar4);
                            uVar96 = (ulong)uVar73;
                            *pbVar90 = (byte)(uVar73 >> 1);
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar63;
                          } while (uVar81 != uVar87);
                        }
                        break;
                      case 3:
                        if (iVar80 < 0) goto LAB_00132cbe;
                        uVar87 = 0;
                        uVar96 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar102 = *pbVar90;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 3 & 7)) =
                               bVar102;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar102 - (uint)bVar4));
                          *pbVar90 = (byte)(uVar96 / 3);
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar63;
                        } while (uVar81 != uVar87);
                        break;
                      case 4:
                        if (iVar80 < 0) goto LAB_00132cbe;
                        uVar87 = 0;
                        uVar96 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar102 = *pbVar90;
                          uVar86 = (ulong)((uint)uVar87 & 7);
                          bVar4 = *(byte *)((long)&local_238[0].data + uVar86);
                          *(byte *)((long)&local_238[0].data + (uVar86 ^ 4)) = bVar102;
                          uVar73 = (int)uVar96 + ((uint)bVar102 - (uint)bVar4);
                          uVar96 = (ulong)uVar73;
                          *pbVar90 = (byte)(uVar73 >> 2);
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar63;
                        } while (uVar81 != uVar87);
                        break;
                      case 5:
                        if (iVar80 < 0) goto LAB_00132cbe;
                        uVar87 = 0;
                        uVar96 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar102 = *pbVar90;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 5 & 7)) =
                               bVar102;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar102 - (uint)bVar4));
                          *pbVar90 = (byte)(uVar96 / 5);
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar63;
                        } while (uVar81 != uVar87);
                        break;
                      default:
                        if (iVar80 < 0) {
                          uVar96 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar96 = 0;
                          pbVar90 = pbVar100;
                          do {
                            bVar102 = *pbVar90;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)((int)local_488 + (uint)uVar87 & 7)) = bVar102;
                            uVar96 = (ulong)((int)uVar96 + ((uint)bVar102 - (uint)bVar4));
                            *pbVar90 = (byte)(uVar96 / (local_488 & 0xffffffff));
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar63;
                          } while (uVar81 != uVar87);
                        }
                      }
                      if ((int)uVar72 < (int)(uint)uVar50) {
                        uVar87 = (ulong)(int)uVar72;
                        pbVar90 = pbVar100 + lVar63 * uVar87;
                        do {
                          uVar96 = (ulong)((int)uVar96 -
                                          (uint)*(byte *)((long)&local_238[0].data +
                                                         (ulong)((uint)uVar87 & 7)));
                          *pbVar90 = (byte)(uVar96 / (local_488 & 0xffffffff));
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar63;
                        } while (uVar50 != uVar87);
                      }
                      pbVar100 = pbVar100 + 1;
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar58);
                    sVar71 = *(short *)(local_3b0 + 8);
                    uVar49 = *(ushort *)(local_3b0 + 10);
                    uVar58 = (uint)*(ushort *)(local_3b0 + 4);
                    uVar50 = *(ushort *)(local_3b0 + 6);
                  }
                }
                *local_2d0 = sVar71;
                local_2d0[1] = uVar49;
                local_2d0[2] = sVar71 + (short)uVar58;
                local_2d0[3] = uVar50 + uVar49;
                *(float *)(local_2d0 + 8) =
                     (float)(int)(short)((short)(local_354 << 8) + (short)local_358) *
                     (float)local_318._0_4_;
                *(ulong *)(local_2d0 + 4) =
                     CONCAT44((float)local_34c * local_268._4_4_ + (float)local_258._4_4_,
                              (float)local_348 * local_268._0_4_ + (float)local_258._0_4_);
                *(float *)(local_2d0 + 10) =
                     (float)(int)(uVar58 + local_348) * local_268._0_4_ + (float)local_258._0_4_;
                *(float *)(local_2d0 + 0xc) =
                     (float)(int)((uint)uVar50 + local_34c) * (float)local_278._0_4_ +
                     (float)local_288._0_4_;
                iVar80 = local_3c0[1].fontstart;
                lVar82 = local_2d8;
                lVar78 = local_2c8;
                psVar99 = local_3c0;
                auVar133 = _DAT_0017b730;
                auVar125 = local_268;
              }
            }
            lVar78 = lVar78 + 1;
          } while (lVar78 < iVar80);
        }
        fVar116 = local_2f8[local_338].RasterizerMultiply;
        if ((fVar116 != 1.0) || (NAN(fVar116))) {
          lVar82 = 0;
          auVar119 = _DAT_0017eb90;
          auVar126 = _DAT_0017eb80;
          auVar130 = _DAT_0017eb70;
          auVar132 = _DAT_0017eb60;
          do {
            fVar98 = auVar117._0_4_;
            fVar138 = auVar117._4_4_;
            fVar139 = auVar117._8_4_;
            fVar140 = auVar117._12_4_;
            auVar117 = auVar126 & _DAT_0017eba0 | _DAT_0017ebb0;
            uVar58 = auVar126._4_4_;
            uVar97 = auVar126._8_4_;
            uVar77 = auVar126._12_4_;
            auVar133 = auVar119 & _DAT_0017eba0 | _DAT_0017ebb0;
            uVar72 = auVar119._4_4_;
            uVar73 = auVar119._8_4_;
            uVar148 = auVar119._12_4_;
            auVar165 = auVar132 & _DAT_0017eba0 | _DAT_0017ebb0;
            uVar158 = auVar132._4_4_;
            uVar160 = auVar132._8_4_;
            uVar162 = auVar132._12_4_;
            auVar103 = auVar130 & _DAT_0017eba0 | _DAT_0017ebb0;
            uVar169 = auVar130._4_4_;
            uVar171 = auVar130._8_4_;
            uVar173 = auVar130._12_4_;
            fVar164 = (((float)(auVar130._0_4_ >> 0x10 | 0x53000000) - fVar98) + auVar103._0_4_) *
                      fVar116;
            fVar170 = (((float)(uVar169 >> 0x10 | 0x53000000) - fVar138) + auVar103._4_4_) * fVar116
            ;
            fVar172 = (((float)(uVar171 >> 0x10 | 0x53000000) - fVar139) + auVar103._8_4_) * fVar116
            ;
            fVar174 = (((float)(uVar173 >> 0x10 | 0x53000000) - fVar140) + auVar103._12_4_) *
                      fVar116;
            fVar150 = (((float)(auVar132._0_4_ >> 0x10 | 0x53000000) - fVar98) + auVar165._0_4_) *
                      fVar116;
            fVar159 = (((float)(uVar158 >> 0x10 | 0x53000000) - fVar138) + auVar165._4_4_) * fVar116
            ;
            fVar161 = (((float)(uVar160 >> 0x10 | 0x53000000) - fVar139) + auVar165._8_4_) * fVar116
            ;
            fVar163 = (((float)(uVar162 >> 0x10 | 0x53000000) - fVar140) + auVar165._12_4_) *
                      fVar116;
            fVar141 = (((float)(auVar119._0_4_ >> 0x10 | 0x53000000) - fVar98) + auVar133._0_4_) *
                      fVar116;
            fVar146 = (((float)(uVar72 >> 0x10 | 0x53000000) - fVar138) + auVar133._4_4_) * fVar116;
            fVar147 = (((float)(uVar73 >> 0x10 | 0x53000000) - fVar139) + auVar133._8_4_) * fVar116;
            fVar149 = (((float)(uVar148 >> 0x10 | 0x53000000) - fVar140) + auVar133._12_4_) *
                      fVar116;
            fVar98 = (((float)(auVar126._0_4_ >> 0x10 | 0x53000000) - fVar98) + auVar117._0_4_) *
                     fVar116;
            fVar138 = (((float)(uVar58 >> 0x10 | 0x53000000) - fVar138) + auVar117._4_4_) * fVar116;
            fVar139 = (((float)(uVar97 >> 0x10 | 0x53000000) - fVar139) + auVar117._8_4_) * fVar116;
            fVar140 = (((float)(uVar77 >> 0x10 | 0x53000000) - fVar140) + auVar117._12_4_) * fVar116
            ;
            auVar137._0_4_ = (int)fVar98;
            auVar137._4_4_ = (int)fVar138;
            auVar137._8_4_ = (int)fVar139;
            auVar137._12_4_ = (int)fVar140;
            auVar185._0_4_ = auVar137._0_4_ >> 0x1f;
            auVar185._4_4_ = auVar137._4_4_ >> 0x1f;
            auVar185._8_4_ = auVar137._8_4_ >> 0x1f;
            auVar185._12_4_ = auVar137._12_4_ >> 0x1f;
            auVar136._0_4_ = (int)(fVar98 - 2.1474836e+09);
            auVar136._4_4_ = (int)(fVar138 - 2.1474836e+09);
            auVar136._8_4_ = (int)(fVar139 - 2.1474836e+09);
            auVar136._12_4_ = (int)(fVar140 - 2.1474836e+09);
            auVar137 = auVar136 & auVar185 | auVar137;
            auVar145._0_4_ = (int)fVar141;
            auVar145._4_4_ = (int)fVar146;
            auVar145._8_4_ = (int)fVar147;
            auVar145._12_4_ = (int)fVar149;
            auVar186._0_4_ = auVar145._0_4_ >> 0x1f;
            auVar186._4_4_ = auVar145._4_4_ >> 0x1f;
            auVar186._8_4_ = auVar145._8_4_ >> 0x1f;
            auVar186._12_4_ = auVar145._12_4_ >> 0x1f;
            auVar144._0_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar144._4_4_ = (int)(fVar146 - 2.1474836e+09);
            auVar144._8_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar144._12_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar145 = auVar144 & auVar186 | auVar145;
            auVar181._0_4_ = (int)fVar150;
            auVar181._4_4_ = (int)fVar159;
            auVar181._8_4_ = (int)fVar161;
            auVar181._12_4_ = (int)fVar163;
            auVar189._0_4_ = auVar181._0_4_ >> 0x1f;
            auVar189._4_4_ = auVar181._4_4_ >> 0x1f;
            auVar189._8_4_ = auVar181._8_4_ >> 0x1f;
            auVar189._12_4_ = auVar181._12_4_ >> 0x1f;
            auVar180._0_4_ = (int)(fVar150 - 2.1474836e+09);
            auVar180._4_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar180._8_4_ = (int)(fVar161 - 2.1474836e+09);
            auVar180._12_4_ = (int)(fVar163 - 2.1474836e+09);
            auVar181 = auVar180 & auVar189 | auVar181;
            auVar167._0_4_ = (int)fVar164;
            auVar167._4_4_ = (int)fVar170;
            auVar167._8_4_ = (int)fVar172;
            auVar167._12_4_ = (int)fVar174;
            auVar187._0_4_ = auVar167._0_4_ >> 0x1f;
            auVar187._4_4_ = auVar167._4_4_ >> 0x1f;
            auVar187._8_4_ = auVar167._8_4_ >> 0x1f;
            auVar187._12_4_ = auVar167._12_4_ >> 0x1f;
            auVar166._0_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar166._4_4_ = (int)(fVar170 - 2.1474836e+09);
            auVar166._8_4_ = (int)(fVar172 - 2.1474836e+09);
            auVar166._12_4_ = (int)(fVar174 - 2.1474836e+09);
            auVar167 = auVar166 & auVar187 | auVar167;
            auVar117 = auVar167 ^ _DAT_0017b730;
            auVar156._0_4_ = -(uint)(auVar117._0_4_ < -0x7fffff01);
            auVar156._4_4_ = -(uint)(auVar117._4_4_ < -0x7fffff01);
            auVar156._8_4_ = -(uint)(auVar117._8_4_ < -0x7fffff01);
            auVar156._12_4_ = -(uint)(auVar117._12_4_ < -0x7fffff01);
            auVar117 = ~auVar156 & auVar131 | auVar167 & auVar156;
            auVar133 = auVar181 ^ _DAT_0017b730;
            auVar188._0_4_ = -(uint)(auVar133._0_4_ < -0x7fffff01);
            auVar188._4_4_ = -(uint)(auVar133._4_4_ < -0x7fffff01);
            auVar188._8_4_ = -(uint)(auVar133._8_4_ < -0x7fffff01);
            auVar188._12_4_ = -(uint)(auVar133._12_4_ < -0x7fffff01);
            auVar133 = ~auVar188 & auVar131 | auVar181 & auVar188;
            sVar71 = auVar117._0_2_;
            cVar11 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[0] - (0xff < sVar71);
            sVar71 = auVar117._2_2_;
            sVar51 = CONCAT11((0 < sVar71) * (sVar71 < 0x100) * auVar117[2] - (0xff < sVar71),cVar11
                             );
            sVar71 = auVar117._4_2_;
            cVar110 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[4] - (0xff < sVar71);
            sVar71 = auVar117._6_2_;
            uVar151 = CONCAT13((0 < sVar71) * (sVar71 < 0x100) * auVar117[6] - (0xff < sVar71),
                               CONCAT12(cVar110,sVar51));
            sVar71 = auVar117._8_2_;
            cVar12 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[8] - (0xff < sVar71);
            sVar71 = auVar117._10_2_;
            uVar152 = CONCAT15((0 < sVar71) * (sVar71 < 0x100) * auVar117[10] - (0xff < sVar71),
                               CONCAT14(cVar12,uVar151));
            sVar71 = auVar117._12_2_;
            cVar13 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[0xc] - (0xff < sVar71);
            sVar71 = auVar117._14_2_;
            uVar153 = CONCAT17((0 < sVar71) * (sVar71 < 0x100) * auVar117[0xe] - (0xff < sVar71),
                               CONCAT16(cVar13,uVar152));
            sVar71 = auVar133._0_2_;
            cVar14 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[0] - (0xff < sVar71);
            sVar71 = auVar133._2_2_;
            auVar154._0_10_ =
                 CONCAT19((0 < sVar71) * (sVar71 < 0x100) * auVar133[2] - (0xff < sVar71),
                          CONCAT18(cVar14,uVar153));
            sVar71 = auVar133._4_2_;
            cVar15 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[4] - (0xff < sVar71);
            auVar154[10] = cVar15;
            sVar71 = auVar133._6_2_;
            auVar154[0xb] = (0 < sVar71) * (sVar71 < 0x100) * auVar133[6] - (0xff < sVar71);
            sVar71 = auVar133._8_2_;
            cVar113 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[8] - (0xff < sVar71);
            auVar155[0xc] = cVar113;
            auVar155._0_12_ = auVar154;
            sVar71 = auVar133._10_2_;
            auVar155[0xd] = (0 < sVar71) * (sVar71 < 0x100) * auVar133[10] - (0xff < sVar71);
            sVar71 = auVar133._12_2_;
            cVar111 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[0xc] - (0xff < sVar71);
            auVar157[0xe] = cVar111;
            auVar157._0_14_ = auVar155;
            sVar71 = auVar133._14_2_;
            auVar157[0xf] = (0 < sVar71) * (sVar71 < 0x100) * auVar133[0xe] - (0xff < sVar71);
            auVar117 = auVar145 ^ _DAT_0017b730;
            auVar182._0_4_ = -(uint)(auVar117._0_4_ < -0x7fffff01);
            auVar182._4_4_ = -(uint)(auVar117._4_4_ < -0x7fffff01);
            auVar182._8_4_ = -(uint)(auVar117._8_4_ < -0x7fffff01);
            auVar182._12_4_ = -(uint)(auVar117._12_4_ < -0x7fffff01);
            auVar133 = ~auVar182 & auVar131 | auVar145 & auVar182;
            auVar117 = auVar137 ^ _DAT_0017b730;
            auVar168._0_4_ = -(uint)(auVar117._0_4_ < -0x7fffff01);
            auVar168._4_4_ = -(uint)(auVar117._4_4_ < -0x7fffff01);
            auVar168._8_4_ = -(uint)(auVar117._8_4_ < -0x7fffff01);
            auVar168._12_4_ = -(uint)(auVar117._12_4_ < -0x7fffff01);
            auVar117 = ~auVar168 & auVar131 | auVar137 & auVar168;
            sVar71 = auVar133._0_2_;
            cVar16 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[0] - (0xff < sVar71);
            sVar71 = auVar133._2_2_;
            sVar114 = CONCAT11((0 < sVar71) * (sVar71 < 0x100) * auVar133[2] - (0xff < sVar71),
                               cVar16);
            sVar71 = auVar133._4_2_;
            cVar17 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[4] - (0xff < sVar71);
            sVar71 = auVar133._6_2_;
            uVar175 = CONCAT13((0 < sVar71) * (sVar71 < 0x100) * auVar133[6] - (0xff < sVar71),
                               CONCAT12(cVar17,sVar114));
            sVar71 = auVar133._8_2_;
            cVar18 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[8] - (0xff < sVar71);
            sVar71 = auVar133._10_2_;
            uVar176 = CONCAT15((0 < sVar71) * (sVar71 < 0x100) * auVar133[10] - (0xff < sVar71),
                               CONCAT14(cVar18,uVar175));
            sVar71 = auVar133._12_2_;
            cVar19 = (0 < sVar71) * (sVar71 < 0x100) * auVar133[0xc] - (0xff < sVar71);
            sVar71 = auVar133._14_2_;
            uVar177 = CONCAT17((0 < sVar71) * (sVar71 < 0x100) * auVar133[0xe] - (0xff < sVar71),
                               CONCAT16(cVar19,uVar176));
            sVar71 = auVar117._0_2_;
            cVar20 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[0] - (0xff < sVar71);
            sVar71 = auVar117._2_2_;
            auVar178._0_10_ =
                 CONCAT19((0 < sVar71) * (sVar71 < 0x100) * auVar117[2] - (0xff < sVar71),
                          CONCAT18(cVar20,uVar177));
            sVar71 = auVar117._4_2_;
            cVar21 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[4] - (0xff < sVar71);
            auVar178[10] = cVar21;
            sVar71 = auVar117._6_2_;
            auVar178[0xb] = (0 < sVar71) * (sVar71 < 0x100) * auVar117[6] - (0xff < sVar71);
            sVar71 = auVar117._8_2_;
            cVar22 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[8] - (0xff < sVar71);
            auVar179[0xc] = cVar22;
            auVar179._0_12_ = auVar178;
            sVar71 = auVar117._10_2_;
            auVar179[0xd] = (0 < sVar71) * (sVar71 < 0x100) * auVar117[10] - (0xff < sVar71);
            sVar71 = auVar117._12_2_;
            cVar23 = (0 < sVar71) * (sVar71 < 0x100) * auVar117[0xc] - (0xff < sVar71);
            auVar183[0xe] = cVar23;
            auVar183._0_14_ = auVar179;
            sVar71 = auVar117._14_2_;
            auVar183[0xf] = (0 < sVar71) * (sVar71 < 0x100) * auVar117[0xe] - (0xff < sVar71);
            sVar71 = (short)((uint)uVar175 >> 0x10);
            auVar184[1] = (0 < sVar71) * (sVar71 < 0x100) * cVar17 - (0xff < sVar71);
            auVar184[0] = (0 < sVar114) * (sVar114 < 0x100) * cVar16 - (0xff < sVar114);
            sVar71 = (short)((uint6)uVar176 >> 0x20);
            auVar184[2] = (0 < sVar71) * (sVar71 < 0x100) * cVar18 - (0xff < sVar71);
            sVar71 = (short)((ulong)uVar177 >> 0x30);
            auVar184[3] = (0 < sVar71) * (sVar71 < 0x100) * cVar19 - (0xff < sVar71);
            sVar71 = (short)((unkuint10)auVar178._0_10_ >> 0x40);
            auVar184[4] = (0 < sVar71) * (sVar71 < 0x100) * cVar20 - (0xff < sVar71);
            sVar71 = auVar178._10_2_;
            auVar184[5] = (0 < sVar71) * (sVar71 < 0x100) * cVar21 - (0xff < sVar71);
            sVar71 = auVar179._12_2_;
            auVar184[6] = (0 < sVar71) * (sVar71 < 0x100) * cVar22 - (0xff < sVar71);
            sVar71 = auVar183._14_2_;
            auVar184[7] = (0 < sVar71) * (sVar71 < 0x100) * cVar23 - (0xff < sVar71);
            auVar184[8] = (0 < sVar51) * (sVar51 < 0x100) * cVar11 - (0xff < sVar51);
            sVar71 = (short)((uint)uVar151 >> 0x10);
            auVar184[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar110 - (0xff < sVar71);
            sVar71 = (short)((uint6)uVar152 >> 0x20);
            auVar184[10] = (0 < sVar71) * (sVar71 < 0x100) * cVar12 - (0xff < sVar71);
            sVar71 = (short)((ulong)uVar153 >> 0x30);
            auVar184[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar13 - (0xff < sVar71);
            sVar71 = (short)((unkuint10)auVar154._0_10_ >> 0x40);
            auVar184[0xc] = (0 < sVar71) * (sVar71 < 0x100) * cVar14 - (0xff < sVar71);
            sVar71 = auVar154._10_2_;
            auVar184[0xd] = (0 < sVar71) * (sVar71 < 0x100) * cVar15 - (0xff < sVar71);
            sVar71 = auVar155._12_2_;
            auVar184[0xe] = (0 < sVar71) * (sVar71 < 0x100) * cVar113 - (0xff < sVar71);
            sVar71 = auVar157._14_2_;
            auVar184[0xf] = (0 < sVar71) * (sVar71 < 0x100) * cVar111 - (0xff < sVar71);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar82) = auVar184;
            lVar82 = lVar82 + 0x10;
            iVar80 = (int)DAT_0017ec10;
            auVar119._0_4_ = auVar119._0_4_ + iVar80;
            iVar93 = DAT_0017ec10._4_4_;
            auVar119._4_4_ = uVar72 + iVar93;
            iVar59 = DAT_0017ec10._8_4_;
            auVar119._8_4_ = uVar73 + iVar59;
            iVar60 = DAT_0017ec10._12_4_;
            auVar119._12_4_ = uVar148 + iVar60;
            auVar126._0_4_ = auVar126._0_4_ + iVar80;
            auVar126._4_4_ = uVar58 + iVar93;
            auVar126._8_4_ = uVar97 + iVar59;
            auVar126._12_4_ = uVar77 + iVar60;
            auVar130._0_4_ = auVar130._0_4_ + iVar80;
            auVar130._4_4_ = uVar169 + iVar93;
            auVar130._8_4_ = uVar171 + iVar59;
            auVar130._12_4_ = uVar173 + iVar60;
            auVar132._0_4_ = auVar132._0_4_ + iVar80;
            auVar132._4_4_ = uVar158 + iVar93;
            auVar132._8_4_ = uVar160 + iVar59;
            auVar132._12_4_ = uVar162 + iVar60;
            auVar117 = _DAT_0017ebd0;
          } while (lVar82 != 0x100);
          iVar80 = psVar99[1].cff.cursor;
          auVar133 = _DAT_0017b730;
          auVar117 = _DAT_0017ebd0;
          if (0 < iVar80) {
            lVar78._0_4_ = psVar99[1].hmtx;
            lVar78._4_4_ = psVar99[1].kern;
            iVar93 = 0;
            do {
              if ((*(int *)(lVar78 + 0xc) != 0) && (*(ushort *)(lVar78 + 6) != 0)) {
                iVar80 = *(int *)(local_498._8_8_ + 0x30);
                uVar49 = *(ushort *)(lVar78 + 4);
                puVar64 = *(uchar **)(local_498._8_8_ + 0x20) +
                          (ulong)*(ushort *)(lVar78 + 10) * (long)iVar80 +
                          (ulong)*(ushort *)(lVar78 + 8);
                uVar58 = (uint)*(ushort *)(lVar78 + 6);
                do {
                  if ((ulong)uVar49 != 0) {
                    uVar81 = 0;
                    do {
                      puVar64[uVar81] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar64[uVar81]);
                      uVar81 = uVar81 + 1;
                    } while (uVar49 != uVar81);
                  }
                  puVar64 = puVar64 + iVar80;
                  bVar101 = 1 < (int)uVar58;
                  uVar58 = uVar58 - 1;
                } while (bVar101);
                iVar80 = psVar99[1].cff.cursor;
              }
              iVar93 = iVar93 + 1;
              lVar78 = lVar78 + 0x10;
            } while (iVar93 < iVar80);
          }
        }
        psVar99[1].hmtx = 0;
        psVar99[1].kern = 0;
        atlas_00 = (ImFontAtlas *)local_498._8_8_;
      }
      lVar82 = local_338 + 1;
    } while (lVar82 < (int)local_408);
  }
  ImGui::MemFree(local_300);
  ImGui::MemFree(local_340);
  pvVar65 = pvStack_410;
  if (pvStack_410 != (void *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pvStack_410;
    _local_418 = (stbtt__buf)(auVar42 << 0x40);
    ImGui::MemFree(pvVar65);
    pvStack_410._0_4_ = 0;
    pvStack_410._4_4_ = 0;
  }
  iVar80 = (int)local_408;
  uVar81 = (ulong)(int)local_408;
  if ((long)uVar81 < 1) {
    pvVar65 = pvStack_400;
    if (pvStack_400 == (void *)0x0) goto LAB_0013359d;
  }
  else {
    uVar96 = 0;
    auVar109._0_12_ = DAT_0017ec40._0_12_;
    auVar109._12_2_ = DAT_0017ec40._6_2_;
    auVar109._14_2_ = DAT_0017ec40._6_2_;
    auVar108._12_4_ = auVar109._12_4_;
    auVar108._0_10_ = (unkbyte10)DAT_0017ec40;
    auVar108._10_2_ = DAT_0017ec40._4_2_;
    auVar107._10_6_ = auVar108._10_6_;
    auVar107._0_8_ = (undefined8)DAT_0017ec40;
    auVar107._8_2_ = DAT_0017ec40._4_2_;
    local_448._8_8_ = auVar107._8_8_;
    local_448._6_2_ = DAT_0017ec40._2_2_;
    local_448._4_2_ = DAT_0017ec40._2_2_;
    local_448._0_2_ = (undefined2)DAT_0017ec40;
    local_448._2_2_ = local_448._0_2_;
    local_478._0_8_ = pvStack_400;
    pvVar65 = pvStack_400;
    do {
      iVar93 = *(int *)((long)pvVar65 + uVar96 * 0x110 + 0xe8);
      if (iVar93 != 0) {
        lVar82 = uVar96 * 0x110 + local_478._0_8_;
        pIVar10 = ((ImVector<ImFontConfig> *)(local_498._8_8_ + 0x68))->Data;
        pIVar191 = pIVar10 + uVar96;
        pIVar8 = pIVar10[uVar96].DstFont;
        if (pIVar10[uVar96].MergeMode == true) {
          uVar7 = pIVar8->ConfigDataCount;
          sVar71 = uVar7 + 1;
          fVar116 = pIVar8->Ascent;
        }
        else {
          fVar98 = pIVar10[uVar96].SizePixels;
          lVar63 = *(long *)(lVar82 + 8);
          lVar78 = (long)*(int *)(lVar82 + 0x24);
          uVar58 = (uint)*(byte *)(lVar63 + 4 + lVar78);
          bVar102 = *(byte *)(lVar63 + 5 + lVar78);
          bVar4 = *(byte *)(lVar63 + 7 + lVar78);
          bVar5 = *(byte *)(lVar63 + 6 + lVar78);
          ImFont::ClearOutputData(pIVar8);
          iVar93 = (uint)bVar5 * 0x100 + uVar58;
          auVar30._1_9_ = (unkuint9)(byte)((uint)iVar93 >> 0x18) << 8;
          auVar30[0] = (char)((uint)iVar93 >> 0x10);
          auVar30._10_6_ = 0;
          auVar46._1_12_ = SUB1612(auVar30 << 0x28,4);
          auVar46[0] = (char)((uint)iVar93 >> 8);
          auVar46[0xd] = 0;
          auVar47._1_14_ = auVar46 << 8;
          auVar47[0] = (char)iVar93;
          auVar47[0xf] = 0;
          auVar117 = ZEXT416((uint)bVar102 | (uint)bVar4 << 0x10) | auVar47 << 8;
          sVar51 = auVar117._0_2_;
          sVar71 = auVar117._2_2_;
          auVar120._0_4_ = (float)((int)sVar51 - (int)sVar71);
          fVar98 = fVar98 / auVar120._0_4_;
          sVar115 = auVar117._6_2_;
          auVar123._0_14_ = ZEXT414((uint)auVar120._0_4_);
          auVar123._14_2_ = sVar115;
          sVar114 = auVar117._4_2_;
          auVar122._12_4_ = auVar123._12_4_;
          auVar122._4_6_ = 0;
          auVar122._0_4_ = auVar120._0_4_;
          auVar122._10_2_ = sVar114;
          auVar121._10_6_ = auVar122._10_6_;
          auVar121._4_6_ = 0;
          auVar121._0_4_ = auVar120._0_4_;
          auVar120._8_8_ = auVar121._8_8_;
          auVar120._6_2_ = sVar71;
          auVar120._4_2_ = (short)((uint)auVar120._0_4_ >> 0x10);
          auVar127._0_2_ = -(ushort)(sVar51 < (short)local_448._0_2_);
          auVar127._2_2_ = -(ushort)(sVar51 < (short)local_448._2_2_);
          auVar127._4_2_ = -(ushort)(sVar71 < (short)local_448._4_2_);
          auVar127._6_2_ = -(ushort)(sVar71 < (short)local_448._6_2_);
          auVar127._8_2_ = -(ushort)(sVar114 < (short)local_448._8_2_);
          auVar127._10_2_ = -(ushort)(sVar114 < (short)local_448._10_2_);
          auVar127._12_2_ = -(ushort)(sVar115 < (short)local_448._12_2_);
          auVar127._14_2_ = -(ushort)(sVar115 < (short)local_448._14_2_);
          auVar117 = auVar127 & _DAT_0017b710 | ~auVar127 & _DAT_0017b750;
          fVar116 = (float)(int)(fVar98 * (float)(int)sVar51 + auVar117._0_4_);
          pIVar8->FontSize = pIVar191->SizePixels;
          pIVar8->ConfigData = pIVar191;
          pIVar8->ContainerAtlas = (ImFontAtlas *)local_498._8_8_;
          pIVar8->Ascent = fVar116;
          pIVar8->Descent = (float)(int)(fVar98 * (float)(auVar120._4_4_ >> 0x10) + auVar117._4_4_);
          iVar93 = *(int *)(lVar82 + 0xe8);
          sVar71 = 1;
        }
        pIVar8->ConfigDataCount = sVar71;
        if (0 < iVar93) {
          fVar98 = (pIVar191->GlyphOffset).x;
          fVar116 = (float)(int)(fVar116 + 0.5) + (pIVar191->GlyphOffset).y;
          lVar63 = 0;
          lVar78 = 0;
          do {
            lVar76 = *(long *)(lVar82 + 0xd0);
            fVar139 = 1.0 / (float)*(int *)(local_498._8_8_ + 0x34);
            fVar138 = 1.0 / (float)*(int *)(local_498._8_8_ + 0x30);
            ImFont::AddGlyph(pIVar8,pIVar191,*(ImWchar *)(*(long *)(lVar82 + 0x108) + lVar78 * 4),
                             *(float *)(lVar76 + 8 + lVar63) + 0.0 + fVar98,
                             *(float *)(lVar76 + 0xc + lVar63) + 0.0 + fVar116,
                             *(float *)(lVar76 + 0x14 + lVar63) + 0.0 + fVar98,
                             *(float *)(lVar76 + 0x18 + lVar63) + 0.0 + fVar116,
                             (float)*(ushort *)(lVar76 + lVar63) * fVar138,
                             (float)*(ushort *)(lVar76 + 2 + lVar63) * fVar139,
                             (float)*(ushort *)(lVar76 + 4 + lVar63) * fVar138,
                             (float)*(ushort *)(lVar76 + 6 + lVar63) * fVar139,
                             *(float *)(lVar76 + 0x10 + lVar63));
            lVar78 = lVar78 + 1;
            lVar63 = lVar63 + 0x1c;
          } while (lVar78 < *(int *)(lVar82 + 0xe8));
        }
      }
      atlas_00 = (ImFontAtlas *)local_498._8_8_;
      uVar96 = uVar96 + 1;
      pvVar65 = (void *)local_478._0_8_;
    } while (uVar96 < uVar81);
    if (0 < iVar80) {
      puVar68 = (undefined8 *)(local_478._0_8_ + 0x108);
      uVar96 = 0;
      do {
        if ((void *)*puVar68 != (void *)0x0) {
          ImGui::MemFree((void *)*puVar68);
        }
        if ((void *)puVar68[-2] != (void *)0x0) {
          ImGui::MemFree((void *)puVar68[-2]);
        }
        uVar96 = uVar96 + 1;
        puVar68 = puVar68 + 0x22;
      } while (uVar96 < uVar81);
    }
  }
  local_408 = 0;
  ImGui::MemFree(pvVar65);
  pvStack_400 = (void *)0x0;
LAB_0013359d:
  ImFontAtlasBuildFinish(atlas_00);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  bVar101 = true;
  pvVar65 = (void *)0x0;
LAB_001335bc:
  if (pvStack_3d0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3d0);
  }
  if (pvVar65 != (void *)0x0) {
    ImGui::MemFree(pvVar65);
  }
  return bVar101;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}